

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O3

void secp256k1_scalar_mul(secp256k1_scalar *r,secp256k1_scalar *a,secp256k1_scalar *b)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined8 uVar62;
  int iVar63;
  ulong uVar64;
  ulong uVar65;
  ulong uVar66;
  ulong uVar67;
  ulong uVar68;
  secp256k1_gej *psVar69;
  int64_t iVar70;
  int64_t iVar71;
  ulong uVar72;
  uint64_t *puVar73;
  secp256k1_gej *psVar74;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  ulong extraout_RAX_05;
  ulong extraout_RAX_06;
  ulong extraout_RAX_07;
  long lVar75;
  byte bVar76;
  uint uVar77;
  secp256k1_modinv64_signed62 *psVar78;
  secp256k1_gej *psVar79;
  secp256k1_modinv64_signed62 *psVar80;
  ulong uVar81;
  ulong uVar82;
  ulong uVar83;
  ulong uVar84;
  ulong uVar85;
  ulong *extraout_RDX;
  long lVar86;
  long lVar87;
  long extraout_RDX_00;
  long extraout_RDX_01;
  long extraout_RDX_02;
  long extraout_RDX_03;
  long extraout_RDX_04;
  long extraout_RDX_05;
  long extraout_RDX_06;
  long extraout_RDX_07;
  long extraout_RDX_08;
  secp256k1_modinv64_signed62 *a_00;
  long *extraout_RDX_09;
  long lVar88;
  secp256k1_modinv64_signed62 *b_00;
  uint64_t *pb;
  secp256k1_gej *psVar89;
  secp256k1_gej *psVar90;
  long lVar91;
  uint uVar92;
  uint uVar93;
  secp256k1_gej *a_02;
  ulong uVar94;
  ulong uVar95;
  ulong uVar96;
  ulong uVar97;
  secp256k1_gej *psVar98;
  secp256k1_gej *psVar99;
  ulong uVar100;
  ulong uVar101;
  ulong uVar102;
  ulong uVar103;
  ulong uVar104;
  ulong uVar105;
  ulong uVar106;
  ulong uVar107;
  secp256k1_gej *psVar108;
  secp256k1_gej *psVar109;
  undefined1 *puVar110;
  secp256k1_gej *psVar111;
  secp256k1_gej *psVar112;
  secp256k1_gej *psVar113;
  long lVar114;
  long lVar115;
  secp256k1_modinv64_signed62 *psVar116;
  bool bVar117;
  uint64_t c;
  uint64_t p4;
  uint64_t p3;
  uint64_t p2;
  uint64_t p1;
  uint64_t p0;
  uint64_t m6;
  uint64_t m5;
  uint64_t m4;
  uint64_t m3;
  uint64_t m2;
  uint64_t m1;
  uint64_t m0;
  uint64_t l [8];
  secp256k1_modinv64_signed62 sStack_400;
  secp256k1_modinv64_signed62 sStack_3d8;
  secp256k1_gej *psStack_3b0;
  secp256k1_gej *psStack_3a8;
  secp256k1_modinv64_signed62 *psStack_3a0;
  ulong uStack_398;
  secp256k1_gej *psStack_390;
  ulong uStack_388;
  secp256k1_gej *psStack_380;
  secp256k1_modinv64_signed62 *psStack_378;
  secp256k1_gej *psStack_370;
  uint64_t uStack_368;
  uint64_t uStack_360;
  secp256k1_gej *psStack_358;
  uint64_t uStack_350;
  uint64_t uStack_348;
  uint64_t uStack_340;
  uint64_t uStack_338;
  uint64_t uStack_330;
  secp256k1_gej *psStack_328;
  secp256k1_gej *psStack_320;
  secp256k1_gej *psStack_318;
  secp256k1_gej *psStack_310;
  secp256k1_gej *psStack_308;
  long lStack_300;
  secp256k1_gej *psStack_2f8;
  code *pcStack_2f0;
  uint uStack_2e4;
  ulong uStack_2e0;
  secp256k1_gej *apsStack_2d8 [2];
  undefined1 auStack_2c8 [56];
  uint64_t auStack_290 [5];
  secp256k1_modinv64_trans2x2 sStack_268;
  undefined1 auStack_248 [96];
  secp256k1_gej *psStack_1e8;
  ulong uStack_1e0;
  secp256k1_gej *psStack_1d8;
  ulong uStack_1d0;
  secp256k1_scalar *psStack_1c8;
  secp256k1_gej *psStack_1b8;
  secp256k1_gej *psStack_1b0;
  secp256k1_gej *psStack_1a0;
  secp256k1_fe *psStack_198;
  secp256k1_fe sStack_190;
  ulong uStack_160;
  ulong uStack_158;
  code *pcStack_150;
  ulong local_140;
  ulong local_138;
  ulong local_130;
  ulong local_128;
  ulong local_120;
  ulong local_118;
  secp256k1_gej *local_110;
  ulong local_108;
  ulong local_100;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  secp256k1_gej *local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  undefined1 local_48 [16];
  secp256k1_fe *a_01;
  
  pcStack_150 = (code *)0x1411a2;
  secp256k1_scalar_verify(a);
  pcStack_150 = (code *)0x1411aa;
  secp256k1_scalar_verify(b);
  uVar65 = a->d[0];
  uVar72 = a->d[1];
  uVar68 = a->d[2];
  uVar66 = b->d[0];
  uVar67 = b->d[1];
  uVar107 = b->d[2];
  uVar102 = b->d[3];
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar65;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = uVar66;
  uVar81 = SUB168(auVar5 * auVar21,8);
  auVar59._8_8_ = 0;
  auVar59._0_8_ = uVar81;
  local_78 = SUB168(auVar5 * auVar21,0);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar65;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = uVar67;
  auVar6 = auVar6 * auVar22;
  uVar94 = SUB168(auVar6 + auVar59,0);
  uVar100 = SUB168(auVar6 + auVar59,8);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar72;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = uVar66;
  uVar82 = SUB168(auVar7 * auVar23,8);
  uVar64 = SUB168(auVar7 * auVar23,0);
  local_70 = uVar94 + uVar64;
  uVar64 = (ulong)CARRY8(uVar94,uVar64);
  uVar94 = uVar100 + uVar82;
  uVar101 = uVar94 + uVar64;
  uVar103 = (ulong)CARRY8(auVar6._8_8_,(ulong)CARRY8(uVar81,auVar6._0_8_)) +
            (ulong)(CARRY8(uVar100,uVar82) || CARRY8(uVar94,uVar64));
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar65;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = uVar107;
  uVar83 = SUB168(auVar8 * auVar24,8);
  uVar64 = SUB168(auVar8 * auVar24,0);
  uVar81 = uVar101 + uVar64;
  uVar64 = (ulong)CARRY8(uVar101,uVar64);
  uVar82 = uVar103 + uVar83;
  uVar104 = uVar82 + uVar64;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar72;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = uVar67;
  uVar84 = SUB168(auVar9 * auVar25,8);
  uVar94 = SUB168(auVar9 * auVar25,0);
  uVar101 = uVar81 + uVar94;
  uVar94 = (ulong)CARRY8(uVar81,uVar94);
  uVar100 = uVar104 + uVar84;
  uVar105 = uVar100 + uVar94;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar68;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = uVar66;
  uVar85 = SUB168(auVar10 * auVar26,8);
  uVar81 = SUB168(auVar10 * auVar26,0);
  local_68 = uVar101 + uVar81;
  uVar81 = (ulong)CARRY8(uVar101,uVar81);
  uVar101 = uVar105 + uVar85;
  uVar106 = uVar101 + uVar81;
  uVar105 = (ulong)(CARRY8(uVar103,uVar83) || CARRY8(uVar82,uVar64)) +
            (ulong)(CARRY8(uVar104,uVar84) || CARRY8(uVar100,uVar94)) +
            (ulong)(CARRY8(uVar105,uVar85) || CARRY8(uVar101,uVar81));
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar65;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = uVar102;
  uVar84 = SUB168(auVar11 * auVar27,8);
  uVar65 = SUB168(auVar11 * auVar27,0);
  uVar81 = uVar106 + uVar65;
  uVar64 = (ulong)CARRY8(uVar106,uVar65);
  uVar82 = uVar105 + uVar84;
  uVar106 = uVar82 + uVar64;
  uVar65 = a->d[3];
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar72;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = uVar107;
  uVar85 = SUB168(auVar12 * auVar28,8);
  uVar94 = SUB168(auVar12 * auVar28,0);
  uVar101 = uVar81 + uVar94;
  uVar94 = (ulong)CARRY8(uVar81,uVar94);
  uVar100 = uVar106 + uVar85;
  uVar95 = uVar100 + uVar94;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar68;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = uVar67;
  uVar103 = SUB168(auVar13 * auVar29,8);
  uVar81 = SUB168(auVar13 * auVar29,0);
  uVar83 = uVar101 + uVar81;
  uVar81 = (ulong)CARRY8(uVar101,uVar81);
  uVar101 = uVar95 + uVar103;
  uVar96 = uVar101 + uVar81;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar65;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = uVar66;
  uVar104 = SUB168(auVar14 * auVar30,8);
  uVar66 = SUB168(auVar14 * auVar30,0);
  local_60 = uVar83 + uVar66;
  uVar66 = (ulong)CARRY8(uVar83,uVar66);
  uVar83 = uVar96 + uVar104;
  uVar97 = uVar83 + uVar66;
  uVar84 = (ulong)(CARRY8(uVar105,uVar84) || CARRY8(uVar82,uVar64)) +
           (ulong)(CARRY8(uVar106,uVar85) || CARRY8(uVar100,uVar94)) +
           (ulong)(CARRY8(uVar95,uVar103) || CARRY8(uVar101,uVar81)) +
           (ulong)(CARRY8(uVar96,uVar104) || CARRY8(uVar83,uVar66));
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar72;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = uVar102;
  uVar100 = SUB168(auVar15 * auVar31,8);
  uVar66 = SUB168(auVar15 * auVar31,0);
  uVar81 = uVar97 + uVar66;
  uVar66 = (ulong)CARRY8(uVar97,uVar66);
  uVar94 = uVar84 + uVar100;
  uVar85 = uVar94 + uVar66;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar68;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = uVar107;
  uVar101 = SUB168(auVar16 * auVar32,8);
  uVar64 = SUB168(auVar16 * auVar32,0);
  uVar82 = uVar81 + uVar64;
  uVar64 = (ulong)CARRY8(uVar81,uVar64);
  uVar81 = uVar85 + uVar101;
  uVar103 = uVar81 + uVar64;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar65;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = uVar67;
  uVar83 = SUB168(auVar17 * auVar33,8);
  uVar67 = SUB168(auVar17 * auVar33,0);
  local_58 = uVar82 + uVar67;
  uVar67 = (ulong)CARRY8(uVar82,uVar67);
  uVar82 = uVar103 + uVar83;
  uVar104 = uVar82 + uVar67;
  uVar82 = (ulong)(CARRY8(uVar84,uVar100) || CARRY8(uVar94,uVar66)) +
           (ulong)(CARRY8(uVar85,uVar101) || CARRY8(uVar81,uVar64)) +
           (ulong)(CARRY8(uVar103,uVar83) || CARRY8(uVar82,uVar67));
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar68;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = uVar102;
  uVar64 = SUB168(auVar18 * auVar34,8);
  uVar68 = SUB168(auVar18 * auVar34,0);
  uVar81 = uVar104 + uVar68;
  uVar68 = (ulong)CARRY8(uVar104,uVar68);
  uVar67 = uVar82 + uVar64;
  uVar100 = uVar67 + uVar68;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar65;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = uVar107;
  uVar94 = SUB168(auVar19 * auVar35,8);
  uVar66 = SUB168(auVar19 * auVar35,0);
  local_50 = uVar81 + uVar66;
  uVar66 = (ulong)CARRY8(uVar81,uVar66);
  uVar107 = uVar100 + uVar94;
  auVar53._8_8_ =
       (ulong)(CARRY8(uVar82,uVar64) || CARRY8(uVar67,uVar68)) +
       (ulong)(CARRY8(uVar100,uVar94) || CARRY8(uVar107,uVar66));
  auVar53._0_8_ = uVar107 + uVar66;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar65;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = uVar102;
  local_48 = auVar20 * auVar36 + auVar53;
  uVar62 = local_48._8_8_;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = local_78;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = local_58;
  auVar54 = ZEXT816(0x402da1732fc9bebf) * auVar37 + auVar54;
  local_e8 = auVar54._0_8_;
  uVar68 = auVar54._8_8_;
  uVar67 = uVar68 + local_70;
  uVar68 = (ulong)CARRY8(uVar68,local_70);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = local_50;
  uVar64 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar38,8);
  uVar66 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar38,0);
  uVar102 = uVar67 + uVar66;
  uVar66 = (ulong)CARRY8(uVar67,uVar66);
  uVar107 = uVar68 + uVar64;
  uVar81 = uVar107 + uVar66;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = local_58;
  uVar94 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar39,8);
  uVar67 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar39,0);
  local_f0 = uVar102 + uVar67;
  uVar67 = (ulong)CARRY8(uVar102,uVar67);
  uVar102 = uVar81 + uVar94;
  uVar100 = uVar102 + uVar67;
  uVar82 = (ulong)(CARRY8(uVar68,uVar64) || CARRY8(uVar107,uVar66)) +
           (ulong)(CARRY8(uVar81,uVar94) || CARRY8(uVar102,uVar67));
  uVar67 = uVar100 + local_68;
  uVar68 = (ulong)CARRY8(uVar100,local_68);
  uVar100 = uVar82 + uVar68;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = local_48._0_8_;
  uVar94 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar40,8);
  uVar66 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar40,0);
  uVar107 = uVar67 + uVar66;
  uVar66 = (ulong)CARRY8(uVar67,uVar66);
  uVar102 = uVar100 + uVar94;
  uVar101 = uVar102 + uVar66;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = local_50;
  uVar81 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar41,8);
  uVar67 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar41,0);
  uVar84 = uVar107 + uVar67;
  uVar67 = (ulong)CARRY8(uVar107,uVar67);
  uVar64 = uVar101 + uVar81;
  uVar83 = uVar64 + uVar67;
  local_f8 = uVar84 + local_58;
  uVar107 = (ulong)CARRY8(uVar84,local_58);
  uVar84 = uVar83 + uVar107;
  uVar100 = (ulong)CARRY8(uVar82,uVar68) + (ulong)(CARRY8(uVar100,uVar94) || CARRY8(uVar102,uVar66))
            + (ulong)(CARRY8(uVar101,uVar81) || CARRY8(uVar64,uVar67)) +
            (ulong)CARRY8(uVar83,uVar107);
  uVar67 = uVar84 + local_60;
  uVar68 = (ulong)CARRY8(uVar84,local_60);
  uVar101 = uVar100 + uVar68;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = local_48._8_8_;
  uVar94 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar42,8);
  uVar66 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar42,0);
  uVar107 = uVar67 + uVar66;
  uVar66 = (ulong)CARRY8(uVar67,uVar66);
  uVar102 = uVar101 + uVar94;
  uVar83 = uVar102 + uVar66;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = local_48._0_8_;
  uVar81 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar43,8);
  uVar67 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar43,0);
  uVar82 = uVar107 + uVar67;
  uVar67 = (ulong)CARRY8(uVar107,uVar67);
  uVar64 = uVar83 + uVar81;
  uVar84 = uVar64 + uVar67;
  local_100 = uVar82 + local_50;
  uVar107 = (ulong)CARRY8(uVar82,local_50);
  uVar82 = uVar84 + uVar107;
  uVar102 = (ulong)CARRY8(uVar100,uVar68) +
            (ulong)(CARRY8(uVar101,uVar94) || CARRY8(uVar102,uVar66)) +
            (ulong)(CARRY8(uVar83,uVar81) || CARRY8(uVar64,uVar67)) + (ulong)CARRY8(uVar84,uVar107);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = local_48._8_8_;
  uVar107 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar44,8);
  uVar68 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar44,0);
  uVar66 = uVar82 + uVar68;
  uVar68 = (ulong)CARRY8(uVar82,uVar68);
  uVar67 = uVar102 + uVar107;
  uVar64 = uVar67 + uVar68;
  auVar60._8_8_ = uVar64;
  auVar60._0_8_ = uVar66;
  local_108 = SUB168(local_48 + auVar60,0);
  uVar66 = (ulong)CARRY8(uVar66,local_48._0_8_);
  psVar108 = SUB168(local_48 + auVar60,8);
  uVar82 = (ulong)(CARRY8(uVar102,uVar107) || CARRY8(uVar67,uVar68)) + (ulong)CARRY8(uVar64,uVar66)
           + (ulong)CARRY8(uVar64 + uVar66,local_48._8_8_);
  auVar58._8_8_ = uVar82;
  auVar58._0_8_ = psVar108;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = local_e8;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = local_108;
  auVar55 = ZEXT816(0x402da1732fc9bebf) * auVar45 + auVar55;
  local_120 = auVar55._0_8_;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = local_120;
  uVar68 = auVar55._8_8_;
  uVar67 = uVar68 + local_f0;
  uVar68 = (ulong)CARRY8(uVar68,local_f0);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = psVar108;
  uVar64 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar46,8);
  uVar66 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar46,0);
  uVar102 = uVar67 + uVar66;
  uVar66 = (ulong)CARRY8(uVar67,uVar66);
  uVar107 = uVar68 + uVar64;
  uVar81 = uVar107 + uVar66;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = local_108;
  uVar94 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar47,8);
  uVar67 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar47,0);
  local_128 = uVar102 + uVar67;
  uVar67 = (ulong)CARRY8(uVar102,uVar67);
  uVar102 = uVar81 + uVar94;
  uVar101 = uVar102 + uVar67;
  uVar100 = (ulong)(CARRY8(uVar68,uVar64) || CARRY8(uVar107,uVar66)) +
            (ulong)(CARRY8(uVar81,uVar94) || CARRY8(uVar102,uVar67));
  uVar67 = uVar101 + local_f8;
  uVar68 = (ulong)CARRY8(uVar101,local_f8);
  uVar101 = uVar100 + uVar68;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = uVar82;
  uVar94 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar48,8);
  uVar66 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar48,0);
  uVar107 = uVar67 + uVar66;
  uVar66 = (ulong)CARRY8(uVar67,uVar66);
  uVar102 = uVar101 + uVar94;
  uVar83 = uVar102 + uVar66;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = psVar108;
  uVar81 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar49,8);
  uVar67 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar49,0);
  uVar85 = uVar107 + uVar67;
  uVar67 = (ulong)CARRY8(uVar107,uVar67);
  uVar64 = uVar83 + uVar81;
  uVar84 = uVar64 + uVar67;
  local_130 = uVar85 + local_108;
  uVar107 = (ulong)CARRY8(uVar85,local_108);
  uVar85 = uVar84 + uVar107;
  auVar56._8_8_ =
       (ulong)CARRY8(uVar100,uVar68) + (ulong)(CARRY8(uVar101,uVar94) || CARRY8(uVar102,uVar66)) +
       (ulong)(CARRY8(uVar83,uVar81) || CARRY8(uVar64,uVar67)) + (ulong)CARRY8(uVar84,uVar107) +
       (ulong)CARRY8(uVar85,local_100);
  auVar56._0_8_ = uVar85 + local_100;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = uVar82;
  auVar58 = ZEXT816(0x4551231950b75fc4) * auVar50 + auVar56 + auVar58;
  local_138 = auVar58._0_8_;
  local_140 = auVar58._8_8_;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = local_140;
  auVar61 = ZEXT816(0x402da1732fc9bebf) * auVar51 + auVar61;
  uVar68 = auVar61._8_8_;
  r->d[0] = auVar61._0_8_;
  auVar57[8] = CARRY8(uVar68,local_128);
  auVar57._0_8_ = uVar68 + local_128;
  auVar57._9_7_ = 0;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = local_140;
  auVar57 = ZEXT816(0x4551231950b75fc4) * auVar52 + auVar57;
  uVar68 = auVar57._8_8_;
  r->d[1] = auVar57._0_8_;
  uVar66 = uVar68 + local_140;
  uVar107 = (ulong)CARRY8(uVar68,local_140) + (ulong)CARRY8(uVar66,local_130);
  r->d[2] = uVar66 + local_130;
  uVar67 = (ulong)CARRY8(uVar107,local_138);
  r->d[3] = uVar107 + local_138;
  uVar1 = r->d[3];
  uVar68 = r->d[2];
  uVar66 = r->d[1];
  uVar77 = (uint)((0xfffffffffffffffd < uVar68 && uVar1 == 0xffffffffffffffff) &&
                 0xbaaedce6af48a03a < uVar66);
  uVar93 = 0;
  if (0xbaaedce6af48a03b < uVar66) {
    uVar93 = uVar77;
  }
  psVar89 = (secp256k1_gej *)r->d[0];
  uVar92 = 0;
  if ((secp256k1_gej *)0xbfd25e8cd0364140 < psVar89) {
    uVar92 = uVar77;
  }
  local_e0._0_4_ = (uint)CARRY8(uVar107,local_138);
  uVar93 = (uVar92 | uVar93 | (uVar68 == 0xffffffffffffffff && uVar1 == 0xffffffffffffffff)) +
           (uint)local_e0;
  a_01 = (secp256k1_fe *)(ulong)uVar93;
  local_118 = uVar82;
  local_110 = psVar108;
  local_e0 = uVar67;
  local_d8 = local_140;
  local_d0 = local_138;
  local_c8 = local_130;
  local_c0 = local_128;
  local_b8 = local_120;
  local_b0 = uVar82;
  local_a8 = psVar108;
  local_a0 = local_108;
  local_98 = local_100;
  local_90 = local_f8;
  local_88 = local_f0;
  local_80 = local_e8;
  if (uVar93 < 2) {
    uVar67 = (ulong)uVar93;
    uVar65 = (ulong)CARRY8(uVar67 * 0x402da1732fc9bebf,(ulong)psVar89);
    uVar72 = uVar67 * 0x4551231950b75fc4 + uVar66;
    r->d[0] = uVar67 * 0x402da1732fc9bebf + (long)psVar89;
    r->d[1] = uVar72 + uVar65;
    uVar65 = (ulong)(CARRY8(uVar67 * 0x4551231950b75fc4,uVar66) || CARRY8(uVar72,uVar65));
    r->d[2] = uVar68 + uVar67 + uVar65;
    r->d[3] = uVar1 + (CARRY8(uVar68,uVar67) || CARRY8(uVar68 + uVar67,uVar65));
    pcStack_150 = (code *)0x141715;
    secp256k1_scalar_verify(r);
    pcStack_150 = (code *)0x14171d;
    secp256k1_scalar_verify(r);
    return;
  }
  pcStack_150 = secp256k1_gej_eq_x_var;
  secp256k1_scalar_mul_cold_1();
  uStack_158 = uVar62;
  psStack_198 = (secp256k1_fe *)0x141748;
  psVar79 = psVar89;
  uStack_160 = uVar72;
  pcStack_150 = (code *)uVar65;
  secp256k1_fe_verify(a_01);
  psStack_198 = (secp256k1_fe *)0x141750;
  psVar99 = psVar89;
  secp256k1_gej_verify(psVar89);
  if (psVar89->infinity == 0) {
    psStack_198 = (secp256k1_fe *)0x141768;
    secp256k1_fe_sqr(&sStack_190,&psVar89->z);
    psStack_198 = (secp256k1_fe *)0x141776;
    secp256k1_fe_mul(&sStack_190,&sStack_190,a_01);
    psStack_198 = (secp256k1_fe *)0x141781;
    secp256k1_fe_equal(&sStack_190,&psVar89->x);
    return;
  }
  psStack_198 = (secp256k1_fe *)secp256k1_fe_cmp_var;
  secp256k1_gej_eq_x_var_cold_1();
  psStack_1b0 = (secp256k1_gej *)0x14179f;
  psVar90 = psVar79;
  psStack_1a0 = psVar89;
  psStack_198 = a_01;
  secp256k1_fe_verify(&psVar99->x);
  psStack_1b0 = (secp256k1_gej *)0x1417a7;
  psVar89 = psVar79;
  secp256k1_fe_verify(&psVar79->x);
  if ((psVar99->x).normalized == 0) {
    psStack_1b0 = (secp256k1_gej *)0x1417e9;
    secp256k1_fe_cmp_var_cold_2();
  }
  else if ((psVar79->x).normalized != 0) {
    uVar93 = 4;
    while( true ) {
      uVar65 = (psVar79->x).n[uVar93];
      uVar72 = (psVar99->x).n[uVar93];
      if (uVar72 >= uVar65 && uVar72 != uVar65) {
        return;
      }
      if (uVar72 < uVar65) break;
      bVar117 = uVar93 == 0;
      uVar93 = uVar93 - 1;
      if (bVar117) {
        return;
      }
    }
    return;
  }
  psStack_1b0 = (secp256k1_gej *)secp256k1_fe_add;
  secp256k1_fe_cmp_var_cold_1();
  psStack_1c8 = (secp256k1_scalar *)0x1417fd;
  psVar109 = psVar90;
  psStack_1b8 = psVar79;
  psStack_1b0 = psVar99;
  secp256k1_fe_verify(&psVar89->x);
  psStack_1c8 = (secp256k1_scalar *)0x141805;
  psVar79 = psVar90;
  secp256k1_fe_verify(&psVar90->x);
  iVar63 = (psVar90->x).magnitude + (psVar89->x).magnitude;
  if (iVar63 < 0x21) {
    (psVar89->x).n[0] = (psVar89->x).n[0] + (psVar90->x).n[0];
    puVar73 = (psVar89->x).n + 1;
    *puVar73 = *puVar73 + (psVar90->x).n[1];
    puVar73 = (psVar89->x).n + 2;
    *puVar73 = *puVar73 + (psVar90->x).n[2];
    puVar73 = (psVar89->x).n + 3;
    *puVar73 = *puVar73 + (psVar90->x).n[3];
    puVar73 = (psVar89->x).n + 4;
    *puVar73 = *puVar73 + (psVar90->x).n[4];
    (psVar89->x).magnitude = iVar63;
    (psVar89->x).normalized = 0;
    secp256k1_fe_verify(&psVar89->x);
    return;
  }
  psStack_1c8 = (secp256k1_scalar *)secp256k1_modinv64_var;
  secp256k1_fe_add_cold_1();
  auStack_248._16_8_ = 0;
  auStack_248._24_8_ = 0;
  auStack_248._0_8_ = 0;
  auStack_248._8_8_ = 0;
  auStack_248._32_8_ = 0;
  auStack_248._72_8_ = 0;
  auStack_248._80_8_ = 0;
  auStack_248._56_8_ = 0;
  auStack_248._64_8_ = 0;
  auStack_248._48_8_ = 1;
  auStack_2c8._32_8_ = (psVar109->x).n[4];
  auStack_2c8._0_8_ = (psVar109->x).n[0];
  auStack_2c8._8_8_ = (psVar109->x).n[1];
  auStack_2c8._16_8_ = (psVar109->x).n[2];
  auStack_2c8._24_8_ = (psVar109->x).n[3];
  auStack_290[3] = (psVar79->x).n[4];
  auStack_2c8._48_8_ = (psVar79->x).n[0];
  auStack_290[0] = (psVar79->x).n[1];
  auStack_290[1] = (psVar79->x).n[2];
  auStack_290[2] = (psVar79->x).n[3];
  uStack_2e0 = 0;
  lVar115 = -1;
  uStack_2e4 = 5;
  apsStack_2d8[0] = psVar79;
  apsStack_2d8[1] = psVar109;
  auStack_248._88_8_ = psVar89;
  psStack_1e8 = psVar108;
  uStack_1e0 = uVar82;
  psStack_1d8 = psVar90;
  uStack_1d0 = uVar65;
  psStack_1c8 = r;
LAB_001418ef:
  psVar79 = (secp256k1_gej *)auStack_2c8._0_8_;
  psVar109 = apsStack_2d8[1];
  psVar69 = (secp256k1_gej *)0x0;
  psVar74 = (secp256k1_gej *)0x0;
  psVar98 = (secp256k1_gej *)0x1;
  uVar93 = 0x3e;
  psVar90 = (secp256k1_gej *)0x1;
  puVar110 = (undefined1 *)auStack_2c8._48_8_;
  psVar99 = (secp256k1_gej *)auStack_2c8._0_8_;
  while( true ) {
    a_02 = (secp256k1_gej *)(-1L << ((byte)uVar93 & 0x3f) | (ulong)puVar110);
    psVar78 = (secp256k1_modinv64_signed62 *)0x0;
    if (a_02 != (secp256k1_gej *)0x0) {
      for (; ((ulong)a_02 >> (long)psVar78 & 1) == 0;
          psVar78 = (secp256k1_modinv64_signed62 *)((long)psVar78->v + 1)) {
      }
    }
    bVar76 = (byte)psVar78;
    psVar111 = (secp256k1_gej *)((ulong)puVar110 >> (bVar76 & 0x3f));
    psVar90 = (secp256k1_gej *)((long)psVar90 << (bVar76 & 0x3f));
    psVar69 = (secp256k1_gej *)((long)psVar69 << (bVar76 & 0x3f));
    lVar115 = lVar115 - (long)psVar78;
    uVar93 = uVar93 - (int)psVar78;
    if (uVar93 == 0) break;
    if (((ulong)psVar99 & 1) == 0) {
      pcStack_2f0 = (code *)0x141d6c;
      secp256k1_modinv64_var_cold_8();
LAB_00141d6c:
      pcStack_2f0 = (code *)0x141d71;
      secp256k1_modinv64_var_cold_7();
LAB_00141d71:
      pcStack_2f0 = (code *)0x141d76;
      secp256k1_modinv64_var_cold_1();
LAB_00141d76:
      pcStack_2f0 = (code *)0x141d7b;
      secp256k1_modinv64_var_cold_2();
LAB_00141d7b:
      pcStack_2f0 = (code *)0x141d80;
      secp256k1_modinv64_var_cold_6();
      psVar111 = psVar99;
      goto LAB_00141d80;
    }
    if (((ulong)psVar111 & 1) == 0) goto LAB_00141d6c;
    a_02 = (secp256k1_gej *)((long)psVar69 * auStack_2c8._48_8_ + (long)psVar90 * auStack_2c8._0_8_)
    ;
    psVar78 = (secp256k1_modinv64_signed62 *)(ulong)(0x3e - uVar93);
    bVar76 = (byte)(0x3e - uVar93);
    psVar89 = (secp256k1_gej *)((long)psVar99 << (bVar76 & 0x3f));
    if (a_02 != psVar89) goto LAB_00141d71;
    psVar89 = (secp256k1_gej *)
              ((long)psVar98 * auStack_2c8._48_8_ + (long)psVar74 * auStack_2c8._0_8_);
    a_02 = (secp256k1_gej *)((long)psVar111 << (bVar76 & 0x3f));
    if (psVar89 != a_02) goto LAB_00141d76;
    psVar78 = (secp256k1_modinv64_signed62 *)(lVar115 - 0x2ea);
    if (psVar78 < (secp256k1_modinv64_signed62 *)0xfffffffffffffa2d) goto LAB_00141d7b;
    iVar63 = (int)psVar111;
    if (lVar115 < 0) {
      lVar115 = -lVar115;
      uVar77 = (int)lVar115 + 1;
      if ((int)uVar93 <= (int)uVar77) {
        uVar77 = uVar93;
      }
      psVar78 = (secp256k1_modinv64_signed62 *)(ulong)uVar77;
      a_02 = (secp256k1_gej *)(ulong)(uVar77 - 0x3f);
      if (0xffffffc1 < uVar77 - 0x3f) {
        psVar113 = (secp256k1_gej *)-(long)psVar69;
        r = (secp256k1_scalar *)-(long)psVar90;
        psVar112 = (secp256k1_gej *)-(long)psVar99;
        psVar89 = (secp256k1_gej *)
                  ((ulong)(0x3fL << (-(char)uVar77 & 0x3fU)) >> (-(char)uVar77 & 0x3fU));
        uVar77 = (iVar63 * iVar63 + 0x3e) * iVar63 * (int)psVar112 & (uint)psVar89;
        psVar69 = psVar98;
        psVar90 = psVar74;
        psVar108 = psVar113;
        goto LAB_00141a4b;
      }
      goto LAB_00141d8a;
    }
    uVar77 = (int)lVar115 + 1;
    if ((int)uVar93 <= (int)uVar77) {
      uVar77 = uVar93;
    }
    psVar78 = (secp256k1_modinv64_signed62 *)(ulong)uVar77;
    a_02 = (secp256k1_gej *)(ulong)(uVar77 - 0x3f);
    if (uVar77 - 0x3f < 0xffffffc2) goto LAB_00141d85;
    psVar89 = (secp256k1_gej *)((ulong)(0xfL << (-(char)uVar77 & 0x3fU)) >> (-(char)uVar77 & 0x3fU))
    ;
    uVar77 = -(iVar63 * (((int)psVar99 * 2 + 2U & 8) + (int)psVar99)) & (uint)psVar89;
    r = (secp256k1_scalar *)psVar74;
    psVar113 = psVar98;
    psVar112 = psVar111;
    psVar111 = psVar99;
LAB_00141a4b:
    uVar65 = (ulong)uVar77;
    a_02 = (secp256k1_gej *)(uVar65 * (long)psVar111);
    puVar110 = (undefined1 *)((long)(psVar112->x).n + (long)(a_02->x).n);
    psVar74 = (secp256k1_gej *)((long)(((secp256k1_gej *)r)->x).n + (long)psVar90 * uVar65);
    psVar78 = (secp256k1_modinv64_signed62 *)(uVar65 * (long)psVar69);
    psVar98 = (secp256k1_gej *)((long)psVar78->v + (long)&psVar113->x);
    psVar99 = psVar111;
    if (((ulong)puVar110 & (ulong)psVar89) != 0) {
LAB_00141d80:
      pcStack_2f0 = (code *)0x141d85;
      secp256k1_modinv64_var_cold_4();
      psVar99 = psVar111;
LAB_00141d85:
      pcStack_2f0 = (code *)0x141d8a;
      secp256k1_modinv64_var_cold_3();
LAB_00141d8a:
      pcStack_2f0 = (code *)0x141d8f;
      secp256k1_modinv64_var_cold_5();
      psVar109 = psVar108;
      goto LAB_00141d8f;
    }
  }
  a_02 = (secp256k1_gej *)((long)psVar69 * (long)psVar74);
  psVar78 = SUB168(SEXT816((long)psVar69) * SEXT816((long)psVar74),8);
  sStack_268.u = (int64_t)psVar90;
  sStack_268.v = (int64_t)psVar69;
  sStack_268.q = (int64_t)psVar74;
  sStack_268.r = (int64_t)psVar98;
  if ((long)psVar90 * (long)psVar98 - (long)a_02 != 0x4000000000000000 ||
      SUB168(SEXT816((long)psVar90) * SEXT816((long)psVar98),8) - (long)psVar78 !=
      (ulong)((secp256k1_gej *)((long)psVar90 * (long)psVar98) < a_02)) goto LAB_00141dc6;
  pcStack_2f0 = (code *)0x141ad9;
  secp256k1_modinv64_update_de_62
            ((secp256k1_modinv64_signed62 *)auStack_248,
             (secp256k1_modinv64_signed62 *)(auStack_248 + 0x30),&sStack_268,
             (secp256k1_modinv64_modinfo *)apsStack_2d8[1]);
  uVar93 = uStack_2e4;
  psVar79 = (secp256k1_gej *)auStack_2c8;
  psVar89 = (secp256k1_gej *)(ulong)uStack_2e4;
  psVar90 = (secp256k1_gej *)(ulong)uStack_2e4;
  psVar78 = (secp256k1_modinv64_signed62 *)0xffffffffffffffff;
  pcStack_2f0 = (code *)0x141af6;
  a_02 = psVar79;
  iVar63 = secp256k1_modinv64_mul_cmp_62
                     ((secp256k1_modinv64_signed62 *)psVar79,uStack_2e4,
                      (secp256k1_modinv64_signed62 *)psVar109,-1);
  psVar99 = (secp256k1_gej *)(auStack_2c8 + 0x30);
  if (0 < iVar63) {
    psVar78 = (secp256k1_modinv64_signed62 *)0x1;
    psVar90 = (secp256k1_gej *)(ulong)uVar93;
    pcStack_2f0 = (code *)0x141b15;
    a_02 = psVar79;
    iVar63 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)psVar79,uVar93,
                        (secp256k1_modinv64_signed62 *)psVar109,1);
    if (0 < iVar63) goto LAB_00141d94;
    psVar90 = (secp256k1_gej *)(ulong)uVar93;
    psVar78 = (secp256k1_modinv64_signed62 *)0xffffffffffffffff;
    pcStack_2f0 = (code *)0x141b31;
    a_02 = psVar99;
    iVar63 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)psVar99,uVar93,
                        (secp256k1_modinv64_signed62 *)psVar109,-1);
    if (iVar63 < 1) goto LAB_00141d99;
    psVar78 = (secp256k1_modinv64_signed62 *)0x1;
    psVar90 = (secp256k1_gej *)(ulong)uVar93;
    pcStack_2f0 = (code *)0x141b4b;
    a_02 = psVar99;
    iVar63 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)psVar99,uVar93,
                        (secp256k1_modinv64_signed62 *)psVar109,1);
    if (-1 < iVar63) goto LAB_00141d9e;
    pcStack_2f0 = (code *)0x141b68;
    secp256k1_modinv64_update_fg_62_var
              (uVar93,(secp256k1_modinv64_signed62 *)psVar79,(secp256k1_modinv64_signed62 *)psVar99,
               &sStack_268);
    if ((undefined1 *)auStack_2c8._48_8_ == (undefined1 *)0x0) {
      if (1 < (int)uVar93) {
        uVar65 = 1;
        uVar72 = 0;
        do {
          uVar72 = uVar72 | auStack_290[uVar65 - 1];
          uVar65 = uVar65 + 1;
        } while (uVar93 != uVar65);
        if (uVar72 != 0) goto LAB_00141b98;
      }
      a_02 = (secp256k1_gej *)(auStack_2c8 + 0x30);
      psVar90 = (secp256k1_gej *)(ulong)uVar93;
      psVar78 = (secp256k1_modinv64_signed62 *)0x0;
      pcStack_2f0 = (code *)0x141c7e;
      iVar63 = secp256k1_modinv64_mul_cmp_62
                         ((secp256k1_modinv64_signed62 *)a_02,uVar93,&SECP256K1_SIGNED62_ONE,0);
      if (iVar63 != 0) goto LAB_00141dbc;
      pcStack_2f0 = (code *)0x141ca0;
      iVar63 = secp256k1_modinv64_mul_cmp_62
                         ((secp256k1_modinv64_signed62 *)auStack_2c8,uVar93,&SECP256K1_SIGNED62_ONE,
                          -1);
      psVar79 = apsStack_2d8[0];
      if (iVar63 != 0) {
        pcStack_2f0 = (code *)0x141cc1;
        iVar63 = secp256k1_modinv64_mul_cmp_62
                           ((secp256k1_modinv64_signed62 *)auStack_2c8,uVar93,
                            &SECP256K1_SIGNED62_ONE,1);
        if (iVar63 != 0) {
          psVar90 = (secp256k1_gej *)0x5;
          psVar78 = (secp256k1_modinv64_signed62 *)0x0;
          pcStack_2f0 = (code *)0x141cdb;
          a_02 = psVar79;
          iVar63 = secp256k1_modinv64_mul_cmp_62
                             ((secp256k1_modinv64_signed62 *)psVar79,5,&SECP256K1_SIGNED62_ONE,0);
          if (iVar63 != 0) goto LAB_00141dc1;
          a_02 = (secp256k1_gej *)auStack_248;
          psVar90 = (secp256k1_gej *)0x5;
          psVar78 = (secp256k1_modinv64_signed62 *)0x0;
          pcStack_2f0 = (code *)0x141cfe;
          iVar63 = secp256k1_modinv64_mul_cmp_62
                             ((secp256k1_modinv64_signed62 *)a_02,5,&SECP256K1_SIGNED62_ONE,0);
          if (iVar63 != 0) goto LAB_00141dc1;
          a_02 = (secp256k1_gej *)auStack_2c8;
          psVar78 = (secp256k1_modinv64_signed62 *)0x1;
          psVar90 = (secp256k1_gej *)(ulong)uVar93;
          pcStack_2f0 = (code *)0x141d1a;
          iVar63 = secp256k1_modinv64_mul_cmp_62
                             ((secp256k1_modinv64_signed62 *)a_02,uVar93,
                              (secp256k1_modinv64_signed62 *)psVar109,1);
          if (iVar63 != 0) goto LAB_00141dc1;
        }
      }
      pcStack_2f0 = (code *)0x141d3d;
      secp256k1_modinv64_normalize_62
                ((secp256k1_modinv64_signed62 *)auStack_248,
                 (int64_t)apsStack_2d8[(long)(int)uVar93 + 1],(secp256k1_modinv64_modinfo *)psVar109
                );
      (psVar79->x).n[4] = auStack_248._32_8_;
      (psVar79->x).n[2] = auStack_248._16_8_;
      (psVar79->x).n[3] = auStack_248._24_8_;
      (psVar79->x).n[0] = auStack_248._0_8_;
      (psVar79->x).n[1] = auStack_248._8_8_;
      return;
    }
LAB_00141b98:
    lVar86 = (long)(int)uVar93;
    psVar108 = apsStack_2d8[lVar86 + 1];
    psVar78 = (secp256k1_modinv64_signed62 *)auStack_290[lVar86 + -2];
    a_02 = (secp256k1_gej *)((long)psVar108 >> 0x3f ^ (ulong)psVar108 | lVar86 + -2 >> 0x3f);
    psVar90 = (secp256k1_gej *)((long)psVar78 >> 0x3f ^ (ulong)psVar78 | (ulong)a_02);
    if (psVar90 == (secp256k1_gej *)0x0) {
      psVar89 = (secp256k1_gej *)(ulong)(uVar93 - 1);
      apsStack_2d8[lVar86] = (secp256k1_gej *)((ulong)apsStack_2d8[lVar86] | (long)psVar108 << 0x3e)
      ;
      psVar78 = (secp256k1_modinv64_signed62 *)((long)psVar78 << 0x3e);
      auStack_290[lVar86 + -3] = auStack_290[lVar86 + -3] | (ulong)psVar78;
    }
    if ((int)uStack_2e0 == 0xb) goto LAB_00141da3;
    uVar93 = (uint)psVar89;
    psVar78 = (secp256k1_modinv64_signed62 *)0xffffffffffffffff;
    pcStack_2f0 = (code *)0x141bfc;
    psVar90 = psVar89;
    a_02 = psVar79;
    iVar63 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)psVar79,uVar93,
                        (secp256k1_modinv64_signed62 *)psVar109,-1);
    if (iVar63 < 1) goto LAB_00141da8;
    psVar78 = (secp256k1_modinv64_signed62 *)0x1;
    pcStack_2f0 = (code *)0x141c16;
    psVar90 = psVar89;
    a_02 = psVar79;
    iVar63 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)psVar79,uVar93,
                        (secp256k1_modinv64_signed62 *)psVar109,1);
    if (0 < iVar63) goto LAB_00141dad;
    psVar78 = (secp256k1_modinv64_signed62 *)0xffffffffffffffff;
    pcStack_2f0 = (code *)0x141c32;
    psVar90 = psVar89;
    a_02 = psVar99;
    iVar63 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)psVar99,uVar93,
                        (secp256k1_modinv64_signed62 *)psVar109,-1);
    if (iVar63 < 1) goto LAB_00141db2;
    psVar78 = (secp256k1_modinv64_signed62 *)0x1;
    pcStack_2f0 = (code *)0x141c4c;
    psVar90 = psVar89;
    a_02 = psVar99;
    iVar63 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)psVar99,uVar93,
                        (secp256k1_modinv64_signed62 *)psVar109,1);
    if (-1 < iVar63) goto LAB_00141db7;
    uStack_2e0 = (ulong)((int)uStack_2e0 + 1);
    psVar108 = psVar109;
    uStack_2e4 = uVar93;
    goto LAB_001418ef;
  }
LAB_00141d8f:
  pcStack_2f0 = (code *)0x141d94;
  secp256k1_modinv64_var_cold_20();
LAB_00141d94:
  pcStack_2f0 = (code *)0x141d99;
  secp256k1_modinv64_var_cold_19();
LAB_00141d99:
  pcStack_2f0 = (code *)0x141d9e;
  secp256k1_modinv64_var_cold_18();
LAB_00141d9e:
  pcStack_2f0 = (code *)0x141da3;
  secp256k1_modinv64_var_cold_17();
LAB_00141da3:
  pcStack_2f0 = (code *)0x141da8;
  secp256k1_modinv64_var_cold_14();
LAB_00141da8:
  pcStack_2f0 = (code *)0x141dad;
  secp256k1_modinv64_var_cold_13();
LAB_00141dad:
  pcStack_2f0 = (code *)0x141db2;
  secp256k1_modinv64_var_cold_12();
LAB_00141db2:
  pcStack_2f0 = (code *)0x141db7;
  secp256k1_modinv64_var_cold_11();
LAB_00141db7:
  pcStack_2f0 = (code *)0x141dbc;
  secp256k1_modinv64_var_cold_10();
LAB_00141dbc:
  pcStack_2f0 = (code *)0x141dc1;
  secp256k1_modinv64_var_cold_15();
LAB_00141dc1:
  pcStack_2f0 = (code *)0x141dc6;
  secp256k1_modinv64_var_cold_16();
  psVar108 = psVar109;
LAB_00141dc6:
  pcStack_2f0 = secp256k1_scalar_from_signed62;
  secp256k1_modinv64_var_cold_9();
  uVar65 = (psVar90->x).n[0];
  if (uVar65 >> 0x3e == 0) {
    uVar72 = (psVar90->x).n[1];
    if (0x3fffffffffffffff < uVar72) goto LAB_00141e55;
    psVar78 = (secp256k1_modinv64_signed62 *)(psVar90->x).n[2];
    if ((secp256k1_modinv64_signed62 *)0x3fffffffffffffff < psVar78) goto LAB_00141e5a;
    uVar68 = (psVar90->x).n[3];
    if (0x3fffffffffffffff < uVar68) goto LAB_00141e5f;
    psVar90 = (secp256k1_gej *)(psVar90->x).n[4];
    if (psVar90 < (secp256k1_gej *)&DAT_00000100) {
      (a_02->x).n[0] = uVar72 << 0x3e | uVar65;
      (a_02->x).n[1] = (long)psVar78 << 0x3c | uVar72 >> 2;
      (a_02->x).n[2] = uVar68 << 0x3a | (ulong)psVar78 >> 4;
      (a_02->x).n[3] = (long)psVar90 << 0x38 | uVar68 >> 6;
      secp256k1_scalar_verify((secp256k1_scalar *)a_02);
      return;
    }
  }
  else {
    psStack_2f8 = (secp256k1_gej *)0x141e55;
    secp256k1_scalar_from_signed62_cold_5();
LAB_00141e55:
    psStack_2f8 = (secp256k1_gej *)0x141e5a;
    secp256k1_scalar_from_signed62_cold_4();
LAB_00141e5a:
    psStack_2f8 = (secp256k1_gej *)0x141e5f;
    secp256k1_scalar_from_signed62_cold_3();
LAB_00141e5f:
    psStack_2f8 = (secp256k1_gej *)0x141e64;
    secp256k1_scalar_from_signed62_cold_2();
  }
  psStack_2f8 = (secp256k1_gej *)secp256k1_modinv64_update_de_62;
  secp256k1_scalar_from_signed62_cold_1();
  psStack_2f8 = (secp256k1_gej *)r;
  lStack_300 = lVar115;
  psStack_308 = psVar79;
  psStack_310 = psVar99;
  psStack_318 = psVar108;
  psStack_320 = psVar89;
  uVar1 = (a_02->x).n[0];
  uStack_340 = (a_02->x).n[1];
  uStack_348 = (a_02->x).n[2];
  uStack_350 = (a_02->x).n[3];
  uStack_360 = (a_02->x).n[4];
  uVar2 = (psVar90->x).n[0];
  psStack_328 = (secp256k1_gej *)(psVar90->x).n[1];
  uVar3 = (psVar90->x).n[2];
  uStack_388 = *extraout_RDX;
  psStack_380 = (secp256k1_gej *)extraout_RDX[1];
  uStack_398 = extraout_RDX[2];
  psStack_390 = (secp256k1_gej *)extraout_RDX[3];
  uStack_330 = (psVar90->x).n[3];
  uStack_368 = (psVar90->x).n[4];
  uVar65 = 5;
  psVar79 = (secp256k1_gej *)0xfffffffffffffffe;
  psStack_3a0 = (secp256k1_modinv64_signed62 *)0x141eff;
  psVar89 = a_02;
  iVar63 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)a_02,5,psVar78,-2);
  psVar108 = psVar90;
  if (iVar63 < 1) {
LAB_001429a4:
    psStack_3a0 = (secp256k1_modinv64_signed62 *)0x1429a9;
    secp256k1_modinv64_update_de_62_cold_34();
LAB_001429a9:
    psStack_3a0 = (secp256k1_modinv64_signed62 *)0x1429ae;
    secp256k1_modinv64_update_de_62_cold_33();
LAB_001429ae:
    psStack_3a0 = (secp256k1_modinv64_signed62 *)0x1429b3;
    secp256k1_modinv64_update_de_62_cold_32();
LAB_001429b3:
    psStack_3a0 = (secp256k1_modinv64_signed62 *)0x1429b8;
    secp256k1_modinv64_update_de_62_cold_31();
LAB_001429b8:
    psStack_3a0 = (secp256k1_modinv64_signed62 *)0x1429bd;
    secp256k1_modinv64_update_de_62_cold_30();
    psVar116 = psVar78;
LAB_001429bd:
    psStack_3a0 = (secp256k1_modinv64_signed62 *)0x1429c2;
    secp256k1_modinv64_update_de_62_cold_29();
LAB_001429c2:
    psStack_3a0 = (secp256k1_modinv64_signed62 *)0x1429c7;
    secp256k1_modinv64_update_de_62_cold_1();
    psVar78 = psVar116;
LAB_001429c7:
    psStack_3a0 = (secp256k1_modinv64_signed62 *)0x1429cc;
    secp256k1_modinv64_update_de_62_cold_2();
LAB_001429cc:
    psStack_3a0 = (secp256k1_modinv64_signed62 *)0x1429d1;
    secp256k1_modinv64_update_de_62_cold_19();
LAB_001429d1:
    psStack_3a0 = (secp256k1_modinv64_signed62 *)0x1429d6;
    secp256k1_modinv64_update_de_62_cold_17();
LAB_001429d6:
    psStack_3a0 = (secp256k1_modinv64_signed62 *)0x1429db;
    secp256k1_modinv64_update_de_62_cold_14();
LAB_001429db:
    psStack_3a0 = (secp256k1_modinv64_signed62 *)0x1429e0;
    secp256k1_modinv64_update_de_62_cold_13();
LAB_001429e0:
    psVar90 = psVar89;
    psStack_3a0 = (secp256k1_modinv64_signed62 *)0x1429e5;
    secp256k1_modinv64_update_de_62_cold_12();
LAB_001429e5:
    psStack_3a0 = (secp256k1_modinv64_signed62 *)0x1429ea;
    secp256k1_modinv64_update_de_62_cold_11();
LAB_001429ea:
    psStack_3a0 = (secp256k1_modinv64_signed62 *)0x1429ef;
    secp256k1_modinv64_update_de_62_cold_10();
LAB_001429ef:
    psStack_3a0 = (secp256k1_modinv64_signed62 *)0x1429f4;
    secp256k1_modinv64_update_de_62_cold_9();
    psVar89 = psVar90;
LAB_001429f4:
    psStack_3a0 = (secp256k1_modinv64_signed62 *)0x1429f9;
    secp256k1_modinv64_update_de_62_cold_28();
  }
  else {
    psVar79 = (secp256k1_gej *)0x1;
    uVar65 = 5;
    psStack_3a0 = (secp256k1_modinv64_signed62 *)0x141f21;
    psVar89 = a_02;
    psStack_358 = a_02;
    iVar63 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)a_02,5,psVar78,1);
    if (-1 < iVar63) goto LAB_001429a9;
    uVar65 = 5;
    psVar79 = (secp256k1_gej *)0xfffffffffffffffe;
    psStack_3a0 = (secp256k1_modinv64_signed62 *)0x141f40;
    psVar89 = psVar90;
    iVar63 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)psVar90,5,psVar78,-2);
    if (iVar63 < 1) goto LAB_001429ae;
    psVar79 = (secp256k1_gej *)0x1;
    uVar65 = 5;
    psStack_3a0 = (secp256k1_modinv64_signed62 *)0x141f5d;
    psVar89 = psVar90;
    iVar63 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)psVar90,5,psVar78,1);
    if (-1 < iVar63) goto LAB_001429b3;
    psVar108 = (secp256k1_gej *)0x3fffffffffffffff;
    psStack_3a0 = (secp256k1_modinv64_signed62 *)0x141f83;
    psStack_370 = psVar90;
    uStack_338 = uVar3;
    iVar70 = secp256k1_modinv64_abs(uStack_388);
    psStack_3a0 = (secp256k1_modinv64_signed62 *)0x141f90;
    psVar89 = psStack_380;
    iVar71 = secp256k1_modinv64_abs((int64_t)psStack_380);
    psVar79 = (secp256k1_gej *)(0x4000000000000000 - iVar71);
    if ((long)psVar79 < iVar70) goto LAB_001429b8;
    psStack_3a0 = (secp256k1_modinv64_signed62 *)0x141fab;
    iVar70 = secp256k1_modinv64_abs(uStack_398);
    psStack_3a0 = (secp256k1_modinv64_signed62 *)0x141fb8;
    psVar89 = psStack_390;
    iVar71 = secp256k1_modinv64_abs((int64_t)psStack_390);
    psVar79 = (secp256k1_gej *)(0x4000000000000000 - iVar71);
    psVar116 = psVar78;
    if ((long)psVar79 < iVar70) goto LAB_001429bd;
    uVar65 = uStack_388 * uVar1;
    psVar79 = SUB168(SEXT816((long)uStack_388) * SEXT816((long)uVar1),8);
    uVar72 = (long)psStack_380 * uVar2;
    psVar89 = SUB168(SEXT816((long)psStack_380) * SEXT816((long)uVar2),8);
    a_02 = (secp256k1_gej *)0x7fffffffffffffff;
    lVar115 = (0x7fffffffffffffff - (long)psVar89) - (long)psVar79;
    if ((SBORROW8(0x7fffffffffffffff - (long)psVar89,(long)psVar79) !=
        SBORROW8(lVar115,(ulong)(~uVar72 < uVar65))) !=
        (long)(lVar115 - (ulong)(~uVar72 < uVar65)) < 0 && -1 < (long)psVar89) goto LAB_001429f4;
    psVar99 = (secp256k1_gej *)(uVar72 + uVar65);
    psVar89 = (secp256k1_gej *)
              ((long)(psVar79->x).n + (long)(psVar89->x).n + (ulong)CARRY8(uVar72,uVar65));
    uVar68 = uStack_398 * uVar1;
    lVar86 = SUB168(SEXT816((long)uStack_398) * SEXT816((long)uVar1),8);
    uVar66 = (long)psStack_390 * uVar2;
    lVar87 = SUB168(SEXT816((long)psStack_390) * SEXT816((long)uVar2),8);
    uVar72 = (ulong)(-uVar66 - 1 < uVar68);
    lVar115 = (0x7fffffffffffffff - lVar87) - lVar86;
    bVar117 = (SBORROW8(0x7fffffffffffffff - lVar87,lVar86) != SBORROW8(lVar115,uVar72)) !=
              (long)(lVar115 - uVar72) < 0;
    psVar79 = (secp256k1_gej *)CONCAT71((int7)(-uVar66 - 1 >> 8),bVar117 && -1 < lVar87);
    if (!bVar117 || -1 >= lVar87) {
      psVar116 = (secp256k1_modinv64_signed62 *)((long)uStack_360 >> 0x3f);
      psVar79 = (secp256k1_gej *)((long)uStack_368 >> 0x3f);
      lVar91 = ((ulong)psStack_380 & (ulong)psVar79) + (uStack_388 & (ulong)psVar116);
      psVar109 = (secp256k1_gej *)(uVar66 + uVar68);
      lVar86 = lVar87 + lVar86 + (ulong)CARRY8(uVar66,uVar68);
      lVar115 = psVar78->v[0];
      uVar72 = psVar78[1].v[0];
      uVar65 = lVar91 - (uVar72 * (long)psVar99 + lVar91 & 0x3fffffffffffffff);
      puVar73 = (uint64_t *)(uVar65 * lVar115);
      psVar90 = SUB168(SEXT816((long)uVar65) * SEXT816(lVar115),8);
      psStack_378 = psVar78;
      if (-1 < (long)psVar90) {
        uVar68 = (ulong)((secp256k1_gej *)(-(long)puVar73 - 1U) < psVar99);
        lVar87 = (0x7fffffffffffffff - (long)psVar90) - (long)psVar89;
        if ((SBORROW8(0x7fffffffffffffff - (long)psVar90,(long)psVar89) != SBORROW8(lVar87,uVar68))
            == (long)(lVar87 - uVar68) < 0) goto LAB_001420e6;
LAB_001422a7:
        psStack_3a0 = (secp256k1_modinv64_signed62 *)0x1422ac;
        secp256k1_modinv64_update_de_62_cold_26();
LAB_001422ac:
        lVar91 = (-0x8000000000000000 - lVar115) - (ulong)(uVar72 != 0);
        lVar87 = lVar86 - lVar91;
        if ((SBORROW8(lVar86,lVar91) !=
            SBORROW8(lVar87,(ulong)(psVar109 < (secp256k1_gej *)-uVar72))) ==
            (long)(lVar87 - (ulong)(psVar109 < (secp256k1_gej *)-uVar72)) < 0) goto LAB_00142136;
LAB_001422ce:
        psStack_3a0 = (secp256k1_modinv64_signed62 *)0x1422d3;
        secp256k1_modinv64_update_de_62_cold_25();
        uVar68 = extraout_RAX;
        lVar86 = extraout_RDX_00;
LAB_001422d3:
        psVar69 = (secp256k1_gej *)((-0x8000000000000000 - lVar86) - (ulong)(uVar68 != 0));
        psVar89 = (secp256k1_gej *)
                  (((long)psVar99 - (long)psVar69) - (ulong)(psVar109 < (secp256k1_gej *)-uVar68));
        if ((SBORROW8((long)psVar99,(long)psVar69) !=
            SBORROW8((long)psVar99 - (long)psVar69,(ulong)(psVar109 < (secp256k1_gej *)-uVar68))) ==
            (long)psVar89 < 0) {
LAB_001421b9:
          uVar72 = uVar72 >> 0x3e | lVar115 << 2;
          bVar117 = CARRY8((ulong)psVar109,uVar68);
          psVar109 = (secp256k1_gej *)((long)(psVar109->x).n + uVar68);
          psVar99 = (secp256k1_gej *)((long)(psVar99->x).n + (ulong)bVar117 + lVar86);
          psVar69 = (secp256k1_gej *)(uStack_398 * uStack_340 + uVar72);
          psVar89 = (secp256k1_gej *)
                    (SUB168(SEXT816((long)uStack_398) * SEXT816((long)uStack_340),8) +
                     (lVar115 >> 0x3e) + (ulong)CARRY8(uStack_398 * uStack_340,uVar72));
          uVar72 = (long)psStack_390 * (long)psVar90;
          lVar115 = SUB168(SEXT816((long)psStack_390) * SEXT816((long)psVar90),8);
          if (lVar115 < 0) goto LAB_001422fd;
          uVar68 = (ulong)((secp256k1_gej *)(-1 - uVar72) < psVar69);
          lVar86 = (0x7fffffffffffffff - lVar115) - (long)psVar89;
          psVar78 = (secp256k1_modinv64_signed62 *)(lVar86 - uVar68);
          if ((SBORROW8(0x7fffffffffffffff - lVar115,(long)psVar89) != SBORROW8(lVar86,uVar68)) !=
              (long)psVar78 < 0) goto LAB_00142315;
        }
        else {
LAB_001422f8:
          psStack_3a0 = (secp256k1_modinv64_signed62 *)0x1422fd;
          secp256k1_modinv64_update_de_62_cold_24();
          uVar72 = extraout_RAX_00;
          lVar115 = extraout_RDX_01;
LAB_001422fd:
          psVar78 = (secp256k1_modinv64_signed62 *)
                    ((-0x8000000000000000 - lVar115) - (ulong)(uVar72 != 0));
          if ((SBORROW8((long)psVar89,(long)psVar78) !=
              SBORROW8((long)psVar89 - (long)psVar78,(ulong)(psVar69 < (secp256k1_gej *)-uVar72)))
              != (long)(((long)psVar89 - (long)psVar78) -
                       (ulong)(psVar69 < (secp256k1_gej *)-uVar72)) < 0) {
LAB_00142315:
            psStack_3a0 = (secp256k1_modinv64_signed62 *)0x14231a;
            secp256k1_modinv64_update_de_62_cold_23();
            goto LAB_00142320;
          }
        }
        bVar117 = CARRY8((ulong)psVar69,uVar72);
        psVar69 = (secp256k1_gej *)((long)(psVar69->x).n + uVar72);
        psVar89 = (secp256k1_gej *)((long)(psVar89->x).n + (ulong)bVar117 + lVar115);
        psVar98 = (secp256k1_gej *)psStack_378->v[1];
        psVar78 = psStack_378;
        if (psVar98 == (secp256k1_gej *)0x0) goto LAB_00142320;
        psVar74 = (secp256k1_gej *)((long)psVar98 * uVar65);
        psVar111 = SUB168(SEXT816((long)psVar98) * SEXT816((long)uVar65),8);
        if ((long)psVar111 < 0) goto LAB_001428ba;
        uVar72 = (ulong)((secp256k1_gej *)(-(long)psVar74 - 1U) < psVar109);
        lVar115 = (0x7fffffffffffffff - (long)psVar111) - (long)psVar99;
        if ((SBORROW8(0x7fffffffffffffff - (long)psVar111,(long)psVar99) != SBORROW8(lVar115,uVar72)
            ) != (long)(lVar115 - uVar72) < 0) goto LAB_001428dc;
LAB_00142253:
        bVar117 = CARRY8((ulong)psVar74,(ulong)psVar109);
        psVar74 = (secp256k1_gej *)((long)(psVar74->x).n + (long)(psVar109->x).n);
        psVar111 = (secp256k1_gej *)((long)(psVar99->x).n + (long)(psVar111->x).n + (ulong)bVar117);
        uVar72 = (long)psVar98 * (long)psVar79;
        lVar115 = SUB168(SEXT816((long)psVar98) * SEXT816((long)psVar79),8);
        if (lVar115 < 0) goto LAB_001428e1;
        psVar99 = (secp256k1_gej *)(-1 - uVar72);
        lVar86 = ((long)a_02 - lVar115) - (long)psVar89;
        psVar109 = (secp256k1_gej *)(lVar86 - (ulong)(psVar99 < psVar69));
        if ((SBORROW8((long)a_02 - lVar115,(long)psVar89) !=
            SBORROW8(lVar86,(ulong)(psVar99 < psVar69))) != (long)psVar109 < 0) goto LAB_00142903;
LAB_00142284:
        bVar117 = CARRY8((ulong)psVar69,uVar72);
        psVar69 = (secp256k1_gej *)((long)(psVar69->x).n + uVar72);
        psVar89 = (secp256k1_gej *)((long)(psVar89->x).n + (ulong)bVar117 + lVar115);
        psVar99 = psVar111;
        psVar109 = psVar74;
LAB_00142320:
        psVar111 = psStack_358;
        uVar72 = (long)psVar99 << 2 | (ulong)psVar109 >> 0x3e;
        psVar90 = (secp256k1_gej *)(uStack_388 * uStack_348 + uVar72);
        psVar98 = (secp256k1_gej *)
                  (SUB168(SEXT816((long)uStack_388) * SEXT816((long)uStack_348),8) +
                   ((long)psVar99 >> 0x3e) + (ulong)CARRY8(uStack_388 * uStack_348,uVar72));
        (psStack_358->x).n[0] = (ulong)psVar109 & 0x3fffffffffffffff;
        uVar72 = (long)psStack_380 * uStack_338;
        lVar115 = SUB168(SEXT816((long)psStack_380) * SEXT816((long)uStack_338),8);
        (psStack_370->x).n[0] = (ulong)psVar69 & 0x3fffffffffffffff;
        if (lVar115 < 0) {
          psVar109 = (secp256k1_gej *)((-0x8000000000000000 - lVar115) - (ulong)(uVar72 != 0));
          psVar99 = (secp256k1_gej *)
                    (((long)psVar98 - (long)psVar109) - (ulong)(psVar90 < (secp256k1_gej *)-uVar72))
          ;
          if ((SBORROW8((long)psVar98,(long)psVar109) !=
              SBORROW8((long)psVar98 - (long)psVar109,(ulong)(psVar90 < (secp256k1_gej *)-uVar72)))
              != (long)psVar99 < 0) goto LAB_0014247e;
LAB_0014238e:
          uVar68 = (ulong)psVar69 >> 0x3e | (long)psVar89 << 2;
          bVar117 = CARRY8((ulong)psVar90,uVar72);
          psVar90 = (secp256k1_gej *)((long)(psVar90->x).n + uVar72);
          psVar98 = (secp256k1_gej *)((long)(psVar98->x).n + (ulong)bVar117 + lVar115);
          psVar109 = (secp256k1_gej *)(uStack_398 * uStack_348 + uVar68);
          psVar99 = (secp256k1_gej *)
                    (SUB168(SEXT816((long)uStack_398) * SEXT816((long)uStack_348),8) +
                     ((long)psVar89 >> 0x3e) + (ulong)CARRY8(uStack_398 * uStack_348,uVar68));
          uVar72 = (long)psStack_390 * uStack_338;
          lVar115 = SUB168(SEXT816((long)psStack_390) * SEXT816((long)uStack_338),8);
          if (lVar115 < 0) goto LAB_00142483;
          uVar68 = (ulong)((secp256k1_gej *)(-1 - uVar72) < psVar109);
          lVar86 = ((long)a_02 - lVar115) - (long)psVar99;
          if ((SBORROW8((long)a_02 - lVar115,(long)psVar99) != SBORROW8(lVar86,uVar68)) !=
              (long)(lVar86 - uVar68) < 0) goto LAB_001424a5;
        }
        else {
          psVar99 = (secp256k1_gej *)(-1 - uVar72);
          lVar86 = ((long)a_02 - lVar115) - (long)psVar98;
          psVar109 = (secp256k1_gej *)(lVar86 - (ulong)(psVar99 < psVar90));
          if ((SBORROW8((long)a_02 - lVar115,(long)psVar98) !=
              SBORROW8(lVar86,(ulong)(psVar99 < psVar90))) == (long)psVar109 < 0) goto LAB_0014238e;
LAB_0014247e:
          psStack_3a0 = (secp256k1_modinv64_signed62 *)0x142483;
          secp256k1_modinv64_update_de_62_cold_22();
          uVar72 = extraout_RAX_01;
          lVar115 = extraout_RDX_02;
LAB_00142483:
          lVar87 = (-0x8000000000000000 - lVar115) - (ulong)(uVar72 != 0);
          lVar86 = (long)psVar99 - lVar87;
          if ((SBORROW8((long)psVar99,lVar87) !=
              SBORROW8(lVar86,(ulong)(psVar109 < (secp256k1_gej *)-uVar72))) !=
              (long)(lVar86 - (ulong)(psVar109 < (secp256k1_gej *)-uVar72)) < 0) {
LAB_001424a5:
            psStack_3a0 = (secp256k1_modinv64_signed62 *)0x1424aa;
            secp256k1_modinv64_update_de_62_cold_21();
            goto LAB_001424b0;
          }
        }
        bVar117 = CARRY8((ulong)psVar109,uVar72);
        psVar109 = (secp256k1_gej *)((long)(psVar109->x).n + uVar72);
        psVar99 = (secp256k1_gej *)((long)(psVar99->x).n + (ulong)bVar117 + lVar115);
        psVar74 = (secp256k1_gej *)psVar78->v[2];
        if (psVar74 == (secp256k1_gej *)0x0) goto LAB_001424b0;
        psVar89 = (secp256k1_gej *)((long)psVar74 * uVar65);
        psVar69 = SUB168(SEXT816((long)psVar74) * SEXT816((long)uVar65),8);
        if ((long)psVar69 < 0) goto LAB_00142908;
        uVar72 = (ulong)((secp256k1_gej *)(-(long)psVar89 - 1U) < psVar90);
        lVar115 = ((long)a_02 - (long)psVar69) - (long)psVar98;
        psVar113 = psVar90;
        if ((SBORROW8((long)a_02 - (long)psVar69,(long)psVar98) != SBORROW8(lVar115,uVar72)) !=
            (long)(lVar115 - uVar72) < 0) goto LAB_0014292a;
LAB_00142423:
        bVar117 = CARRY8((ulong)psVar89,(ulong)psVar113);
        psVar89 = (secp256k1_gej *)((long)(psVar89->x).n + (long)(psVar113->x).n);
        psVar69 = (secp256k1_gej *)((long)(psVar98->x).n + (long)(psVar69->x).n + (ulong)bVar117);
        uVar72 = (long)psVar74 * (long)psVar79;
        lVar115 = SUB168(SEXT816((long)psVar74) * SEXT816((long)psVar79),8);
        if (lVar115 < 0) goto LAB_0014292f;
        psVar112 = (secp256k1_gej *)(-1 - uVar72);
        lVar86 = ((long)a_02 - lVar115) - (long)psVar99;
        psVar78 = (secp256k1_modinv64_signed62 *)(lVar86 - (ulong)(psVar112 < psVar109));
        psVar90 = psVar89;
        psVar98 = psVar69;
        if ((SBORROW8((long)a_02 - lVar115,(long)psVar99) !=
            SBORROW8(lVar86,(ulong)(psVar112 < psVar109))) != (long)psVar78 < 0) goto LAB_00142951;
LAB_00142454:
        bVar117 = CARRY8((ulong)psVar109,uVar72);
        psVar109 = (secp256k1_gej *)((long)(psVar109->x).n + uVar72);
        psVar99 = (secp256k1_gej *)((long)(psVar99->x).n + (ulong)bVar117 + lVar115);
LAB_001424b0:
        uVar72 = (long)psVar98 << 2 | (ulong)psVar90 >> 0x3e;
        psVar113 = (secp256k1_gej *)(uStack_388 * uStack_350 + uVar72);
        psVar112 = (secp256k1_gej *)
                   (SUB168(SEXT816((long)uStack_388) * SEXT816((long)uStack_350),8) +
                    ((long)psVar98 >> 0x3e) + (ulong)CARRY8(uStack_388 * uStack_350,uVar72));
        (psVar111->x).n[1] = (ulong)psVar90 & 0x3fffffffffffffff;
        uVar72 = (long)psStack_380 * uStack_330;
        lVar115 = SUB168(SEXT816((long)psStack_380) * SEXT816((long)uStack_330),8);
        (psStack_370->x).n[1] = (ulong)psVar109 & 0x3fffffffffffffff;
        if (lVar115 < 0) {
          uVar68 = (-0x8000000000000000 - lVar115) - (ulong)(uVar72 != 0);
          psVar89 = (secp256k1_gej *)
                    (((long)psVar112 - uVar68) - (ulong)(psVar113 < (secp256k1_gej *)-uVar72));
          if ((SBORROW8((long)psVar112,uVar68) !=
              SBORROW8((long)psVar112 - uVar68,(ulong)(psVar113 < (secp256k1_gej *)-uVar72))) !=
              (long)psVar89 < 0) goto LAB_00142586;
LAB_0014251c:
          uVar66 = (ulong)psVar109 >> 0x3e | (long)psVar99 << 2;
          bVar117 = CARRY8((ulong)psVar113,uVar72);
          psVar113 = (secp256k1_gej *)((long)(psVar113->x).n + uVar72);
          psVar112 = (secp256k1_gej *)((long)(psVar112->x).n + (ulong)bVar117 + lVar115);
          uVar68 = uStack_398 * uStack_350 + uVar66;
          psVar89 = (secp256k1_gej *)
                    (SUB168(SEXT816((long)uStack_398) * SEXT816((long)uStack_350),8) +
                     ((long)psVar99 >> 0x3e) + (ulong)CARRY8(uStack_398 * uStack_350,uVar66));
          uVar72 = (long)psStack_390 * uStack_330;
          lVar115 = SUB168(SEXT816((long)psStack_390) * SEXT816((long)uStack_330),8);
          if (lVar115 < 0) goto LAB_0014258b;
          uVar66 = (ulong)(-uVar72 - 1 < uVar68);
          lVar86 = ((long)a_02 - lVar115) - (long)psVar89;
          bVar117 = SBORROW8((long)a_02 - lVar115,(long)psVar89) != SBORROW8(lVar86,uVar66);
          lVar86 = lVar86 - uVar66;
        }
        else {
          psVar89 = (secp256k1_gej *)(-1 - uVar72);
          lVar86 = ((long)a_02 - lVar115) - (long)psVar112;
          uVar68 = lVar86 - (ulong)(psVar89 < psVar113);
          if ((SBORROW8((long)a_02 - lVar115,(long)psVar112) !=
              SBORROW8(lVar86,(ulong)(psVar89 < psVar113))) == (long)uVar68 < 0) goto LAB_0014251c;
LAB_00142586:
          psStack_3a0 = (secp256k1_modinv64_signed62 *)0x14258b;
          secp256k1_modinv64_update_de_62_cold_20();
          uVar72 = extraout_RAX_02;
          lVar115 = extraout_RDX_03;
LAB_0014258b:
          lVar87 = (-0x8000000000000000 - lVar115) - (ulong)(uVar72 != 0);
          lVar86 = (long)psVar89 - lVar87;
          bVar117 = SBORROW8((long)psVar89,lVar87) != SBORROW8(lVar86,(ulong)(uVar68 < -uVar72));
          lVar86 = lVar86 - (ulong)(uVar68 < -uVar72);
        }
        psVar78 = (secp256k1_modinv64_signed62 *)0x8000000000000000;
        if (bVar117 != lVar86 < 0) goto LAB_001429cc;
        psVar69 = (secp256k1_gej *)(uVar68 + uVar72);
        psVar89 = (secp256k1_gej *)((long)(psVar89->x).n + (ulong)CARRY8(uVar68,uVar72) + lVar115);
        psVar99 = (secp256k1_gej *)psStack_378->v[3];
        if (psVar99 == (secp256k1_gej *)0x0) goto LAB_0014262a;
        psVar74 = (secp256k1_gej *)((long)psVar99 * uVar65);
        psVar111 = SUB168(SEXT816((long)psVar99) * SEXT816((long)uVar65),8);
        if ((long)psVar111 < 0) goto LAB_00142956;
        uVar72 = (ulong)((secp256k1_gej *)(-(long)psVar74 - 1U) < psVar113);
        lVar115 = ((long)a_02 - (long)psVar111) - (long)psVar112;
        if ((SBORROW8((long)a_02 - (long)psVar111,(long)psVar112) != SBORROW8(lVar115,uVar72)) !=
            (long)(lVar115 - uVar72) < 0) goto LAB_00142978;
LAB_001425eb:
        bVar117 = CARRY8((ulong)psVar74,(ulong)psVar113);
        psVar74 = (secp256k1_gej *)((long)(psVar74->x).n + (long)(psVar113->x).n);
        psVar111 = (secp256k1_gej *)((long)(psVar112->x).n + (long)(psVar111->x).n + (ulong)bVar117)
        ;
        uVar72 = (long)psVar99 * (long)psVar79;
        lVar115 = SUB168(SEXT816((long)psVar99) * SEXT816((long)psVar79),8);
        if (lVar115 < 0) goto LAB_0014297d;
        uVar68 = (ulong)((secp256k1_gej *)(-1 - uVar72) < psVar69);
        lVar86 = ((long)a_02 - lVar115) - (long)psVar89;
        psVar112 = psVar111;
        psVar113 = psVar74;
        if ((SBORROW8((long)a_02 - lVar115,(long)psVar89) != SBORROW8(lVar86,uVar68)) ==
            (long)(lVar86 - uVar68) < 0) {
          do {
            bVar117 = CARRY8((ulong)psVar69,uVar72);
            psVar69 = (secp256k1_gej *)((long)(psVar69->x).n + uVar72);
            psVar89 = (secp256k1_gej *)((long)(psVar89->x).n + (ulong)bVar117 + lVar115);
LAB_0014262a:
            psVar90 = psStack_358;
            uVar72 = (long)psVar112 << 2 | (ulong)psVar113 >> 0x3e;
            psVar113 = (secp256k1_gej *)((ulong)psVar113 & 0x3fffffffffffffff);
            psVar109 = (secp256k1_gej *)(uStack_388 * uStack_360 + uVar72);
            psVar99 = (secp256k1_gej *)
                      (SUB168(SEXT816((long)uStack_388) * SEXT816((long)uStack_360),8) +
                       ((long)psVar112 >> 0x3e) + (ulong)CARRY8(uStack_388 * uStack_360,uVar72));
            (psStack_358->x).n[2] = (uint64_t)psVar113;
            uVar72 = (long)psStack_380 * uStack_368;
            lVar115 = SUB168(SEXT816((long)psStack_380) * SEXT816((long)uStack_368),8);
            (psStack_370->x).n[2] = (ulong)psVar69 & 0x3fffffffffffffff;
            if (lVar115 < 0) {
              lVar87 = (-0x8000000000000000 - lVar115) - (ulong)(uVar72 != 0);
              lVar86 = (long)psVar99 - lVar87;
              psVar98 = (secp256k1_gej *)(lVar86 - (ulong)(psVar109 < (secp256k1_gej *)-uVar72));
              if ((SBORROW8((long)psVar99,lVar87) !=
                  SBORROW8(lVar86,(ulong)(psVar109 < (secp256k1_gej *)-uVar72))) !=
                  (long)psVar98 < 0) goto LAB_00142704;
LAB_00142698:
              uVar68 = (ulong)psVar69 >> 0x3e | (long)psVar89 << 2;
              bVar117 = CARRY8((ulong)psVar109,uVar72);
              psVar109 = (secp256k1_gej *)((long)(psVar109->x).n + uVar72);
              psVar99 = (secp256k1_gej *)((long)(psVar99->x).n + (ulong)bVar117 + lVar115);
              psVar113 = (secp256k1_gej *)(uStack_398 * uStack_360 + uVar68);
              psVar98 = (secp256k1_gej *)
                        (SUB168(SEXT816((long)uStack_398) * SEXT816((long)uStack_360),8) +
                         ((long)psVar89 >> 0x3e) + (ulong)CARRY8(uStack_398 * uStack_360,uVar68));
              uVar72 = (long)psStack_390 * uStack_368;
              lVar115 = SUB168(SEXT816((long)psStack_390) * SEXT816((long)uStack_368),8);
              if (lVar115 < 0) goto LAB_00142709;
              psVar89 = (secp256k1_gej *)(-1 - uVar72);
              lVar86 = ((long)a_02 - lVar115) - (long)psVar98;
              bVar117 = SBORROW8((long)a_02 - lVar115,(long)psVar98) !=
                        SBORROW8(lVar86,(ulong)(psVar89 < psVar113));
              psVar69 = (secp256k1_gej *)(lVar86 - (ulong)(psVar89 < psVar113));
            }
            else {
              psVar98 = (secp256k1_gej *)(-1 - uVar72);
              lVar86 = ((long)a_02 - lVar115) - (long)psVar99;
              if ((SBORROW8((long)a_02 - lVar115,(long)psVar99) !=
                  SBORROW8(lVar86,(ulong)(psVar98 < psVar109))) ==
                  (long)(lVar86 - (ulong)(psVar98 < psVar109)) < 0) goto LAB_00142698;
LAB_00142704:
              psStack_3a0 = (secp256k1_modinv64_signed62 *)0x142709;
              secp256k1_modinv64_update_de_62_cold_18();
              uVar72 = extraout_RAX_03;
              lVar115 = extraout_RDX_04;
LAB_00142709:
              lVar87 = (-0x8000000000000000 - lVar115) - (ulong)(uVar72 != 0);
              lVar86 = (long)psVar98 - lVar87;
              bVar117 = SBORROW8((long)psVar98,lVar87) !=
                        SBORROW8(lVar86,(ulong)(psVar113 < (secp256k1_gej *)-uVar72));
              psVar89 = (secp256k1_gej *)(lVar86 - (ulong)(psVar113 < (secp256k1_gej *)-uVar72));
              psVar69 = psVar89;
            }
            psVar78 = psStack_378;
            psVar111 = (secp256k1_gej *)0x8000000000000000;
            if (bVar117 != (long)psVar69 < 0) goto LAB_001429d1;
            psVar74 = (secp256k1_gej *)((long)(psVar113->x).n + uVar72);
            psVar98 = (secp256k1_gej *)
                      ((long)(psVar98->x).n + (ulong)CARRY8((ulong)psVar113,uVar72) + lVar115);
            psVar69 = (secp256k1_gej *)psStack_378->v[4];
            psVar89 = (secp256k1_gej *)((long)psVar69 * uVar65);
            uVar65 = SUB168(SEXT816((long)psVar69) * SEXT816((long)uVar65),8);
            if ((long)uVar65 < 0) {
              lVar86 = (-0x8000000000000000 - uVar65) - (ulong)(psVar89 != (secp256k1_gej *)0x0);
              lVar115 = (long)psVar99 - lVar86;
              if ((SBORROW8((long)psVar99,lVar86) !=
                  SBORROW8(lVar115,(ulong)(psVar109 < (secp256k1_gej *)-(long)psVar89))) !=
                  (long)(lVar115 - (ulong)(psVar109 < (secp256k1_gej *)-(long)psVar89)) < 0)
              goto LAB_00142895;
LAB_00142764:
              bVar117 = CARRY8((ulong)psVar89,(ulong)psVar109);
              psVar89 = (secp256k1_gej *)((long)(psVar89->x).n + (long)(psVar109->x).n);
              uVar65 = (long)(psVar99->x).n + bVar117 + uVar65;
              uVar72 = (long)psVar69 * (long)psVar79;
              lVar115 = SUB168(SEXT816((long)psVar69) * SEXT816((long)psVar79),8);
              if (lVar115 < 0) goto LAB_0014289a;
              psVar79 = (secp256k1_gej *)(-uVar72 - 1);
              lVar86 = (long)a_02 - lVar115;
              lVar87 = lVar86 - (long)psVar98;
              a_02 = (secp256k1_gej *)(lVar87 - (ulong)(psVar79 < psVar74));
              if ((SBORROW8(lVar86,(long)psVar98) != SBORROW8(lVar87,(ulong)(psVar79 < psVar74))) ==
                  (long)a_02 < 0) goto LAB_00142792;
            }
            else {
              uVar72 = (ulong)((secp256k1_gej *)(-(long)psVar89 - 1U) < psVar109);
              lVar115 = ((long)a_02 - uVar65) - (long)psVar99;
              if ((SBORROW8((long)a_02 - uVar65,(long)psVar99) != SBORROW8(lVar115,uVar72)) ==
                  (long)(lVar115 - uVar72) < 0) goto LAB_00142764;
LAB_00142895:
              psStack_3a0 = (secp256k1_modinv64_signed62 *)0x14289a;
              secp256k1_modinv64_update_de_62_cold_16();
              uVar72 = extraout_RAX_04;
              lVar115 = extraout_RDX_05;
LAB_0014289a:
              psVar99 = (secp256k1_gej *)((-0x8000000000000000 - lVar115) - (ulong)(uVar72 != 0));
              psVar79 = (secp256k1_gej *)
                        (((long)psVar98 - (long)psVar99) -
                        (ulong)(psVar74 < (secp256k1_gej *)-uVar72));
              if ((SBORROW8((long)psVar98,(long)psVar99) !=
                  SBORROW8((long)psVar98 - (long)psVar99,(ulong)(psVar74 < (secp256k1_gej *)-uVar72)
                          )) == (long)psVar79 < 0) {
LAB_00142792:
                a_02 = psStack_370;
                uVar68 = (long)(psVar74->x).n + uVar72;
                lVar115 = (long)(psVar98->x).n + (ulong)CARRY8(uVar72,(ulong)psVar74) + lVar115;
                psVar79 = (secp256k1_gej *)(uVar65 << 2 | (ulong)psVar89 >> 0x3e);
                (psVar90->x).n[3] = (ulong)psVar89 & 0x3fffffffffffffff;
                psVar108 = (secp256k1_gej *)(uVar68 & 0x3fffffffffffffff);
                (psStack_370->x).n[3] = (uint64_t)psVar108;
                psVar89 = (secp256k1_gej *)&psVar79[0xd79435e50d7942].z;
                uVar65 = ((long)uVar65 >> 0x3e) + -1 +
                         (ulong)((secp256k1_gej *)0x7fffffffffffffff < psVar79);
                if (uVar65 != 0xffffffffffffffff) goto LAB_001429d6;
                uVar65 = 0xffffffffffffffff;
                uVar72 = uVar68 >> 0x3e | lVar115 * 4;
                (psVar90->x).n[4] = (uint64_t)psVar79;
                if ((lVar115 >> 0x3e) + -1 + (ulong)(0x7fffffffffffffff < uVar72) != -1)
                goto LAB_001429db;
                (psStack_370->x).n[4] = uVar72;
                uVar65 = 5;
                psVar79 = (secp256k1_gej *)0xfffffffffffffffe;
                psStack_3a0 = (secp256k1_modinv64_signed62 *)0x14280a;
                psVar89 = psVar90;
                iVar63 = secp256k1_modinv64_mul_cmp_62
                                   ((secp256k1_modinv64_signed62 *)psVar90,5,psVar78,-2);
                if (iVar63 < 1) goto LAB_001429e0;
                psVar79 = (secp256k1_gej *)0x1;
                uVar65 = 5;
                psStack_3a0 = (secp256k1_modinv64_signed62 *)0x142827;
                iVar63 = secp256k1_modinv64_mul_cmp_62
                                   ((secp256k1_modinv64_signed62 *)psVar90,5,psVar78,1);
                if (-1 < iVar63) goto LAB_001429e5;
                uVar65 = 5;
                psVar79 = (secp256k1_gej *)0xfffffffffffffffe;
                psStack_3a0 = (secp256k1_modinv64_signed62 *)0x142846;
                psVar90 = a_02;
                iVar63 = secp256k1_modinv64_mul_cmp_62
                                   ((secp256k1_modinv64_signed62 *)a_02,5,psVar78,-2);
                if (iVar63 < 1) goto LAB_001429ea;
                psVar79 = (secp256k1_gej *)0x1;
                uVar65 = 5;
                psStack_3a0 = (secp256k1_modinv64_signed62 *)0x142863;
                psVar90 = a_02;
                iVar63 = secp256k1_modinv64_mul_cmp_62
                                   ((secp256k1_modinv64_signed62 *)a_02,5,psVar78,1);
                if (iVar63 < 0) {
                  return;
                }
                goto LAB_001429ef;
              }
            }
            psStack_3a0 = (secp256k1_modinv64_signed62 *)0x1428ba;
            secp256k1_modinv64_update_de_62_cold_15();
LAB_001428ba:
            lVar86 = (-0x8000000000000000 - (long)psVar111) -
                     (ulong)(psVar74 != (secp256k1_gej *)0x0);
            lVar115 = (long)psVar99 - lVar86;
            if ((SBORROW8((long)psVar99,lVar86) !=
                SBORROW8(lVar115,(ulong)(psVar109 < (secp256k1_gej *)-(long)psVar74))) ==
                (long)(lVar115 - (ulong)(psVar109 < (secp256k1_gej *)-(long)psVar74)) < 0)
            goto LAB_00142253;
LAB_001428dc:
            psStack_3a0 = (secp256k1_modinv64_signed62 *)0x1428e1;
            secp256k1_modinv64_update_de_62_cold_4();
            uVar72 = extraout_RAX_05;
            lVar115 = extraout_RDX_06;
LAB_001428e1:
            psVar109 = (secp256k1_gej *)((-0x8000000000000000 - lVar115) - (ulong)(uVar72 != 0));
            psVar99 = (secp256k1_gej *)
                      (((long)psVar89 - (long)psVar109) -
                      (ulong)(psVar69 < (secp256k1_gej *)-uVar72));
            if ((SBORROW8((long)psVar89,(long)psVar109) !=
                SBORROW8((long)psVar89 - (long)psVar109,(ulong)(psVar69 < (secp256k1_gej *)-uVar72))
                ) == (long)psVar99 < 0) goto LAB_00142284;
LAB_00142903:
            psStack_3a0 = (secp256k1_modinv64_signed62 *)0x142908;
            secp256k1_modinv64_update_de_62_cold_3();
LAB_00142908:
            lVar86 = (-0x8000000000000000 - (long)psVar69) -
                     (ulong)(psVar89 != (secp256k1_gej *)0x0);
            lVar115 = (long)psVar98 - lVar86;
            psVar113 = psVar90;
            if ((SBORROW8((long)psVar98,lVar86) !=
                SBORROW8(lVar115,(ulong)(psVar90 < (secp256k1_gej *)-(long)psVar89))) ==
                (long)(lVar115 - (ulong)(psVar90 < (secp256k1_gej *)-(long)psVar89)) < 0)
            goto LAB_00142423;
LAB_0014292a:
            psStack_3a0 = (secp256k1_modinv64_signed62 *)0x14292f;
            secp256k1_modinv64_update_de_62_cold_6();
            uVar72 = extraout_RAX_06;
            lVar115 = extraout_RDX_07;
            psVar113 = psVar90;
LAB_0014292f:
            psVar78 = (secp256k1_modinv64_signed62 *)
                      ((-0x8000000000000000 - lVar115) - (ulong)(uVar72 != 0));
            psVar112 = (secp256k1_gej *)
                       (((long)psVar99 - (long)psVar78) -
                       (ulong)(psVar109 < (secp256k1_gej *)-uVar72));
            psVar90 = psVar89;
            psVar98 = psVar69;
            if ((SBORROW8((long)psVar99,(long)psVar78) !=
                SBORROW8((long)psVar99 - (long)psVar78,(ulong)(psVar109 < (secp256k1_gej *)-uVar72))
                ) == (long)psVar112 < 0) goto LAB_00142454;
LAB_00142951:
            psStack_3a0 = (secp256k1_modinv64_signed62 *)0x142956;
            secp256k1_modinv64_update_de_62_cold_5();
LAB_00142956:
            lVar86 = (-0x8000000000000000 - (long)psVar111) -
                     (ulong)(psVar74 != (secp256k1_gej *)0x0);
            lVar115 = (long)psVar112 - lVar86;
            if ((SBORROW8((long)psVar112,lVar86) !=
                SBORROW8(lVar115,(ulong)(psVar113 < (secp256k1_gej *)-(long)psVar74))) ==
                (long)(lVar115 - (ulong)(psVar113 < (secp256k1_gej *)-(long)psVar74)) < 0)
            goto LAB_001425eb;
LAB_00142978:
            psStack_3a0 = (secp256k1_modinv64_signed62 *)0x14297d;
            secp256k1_modinv64_update_de_62_cold_8();
            uVar72 = extraout_RAX_07;
            lVar115 = extraout_RDX_08;
LAB_0014297d:
            lVar87 = (-0x8000000000000000 - lVar115) - (ulong)(uVar72 != 0);
            lVar86 = (long)psVar89 - lVar87;
            psVar112 = psVar111;
            psVar113 = psVar74;
            if ((SBORROW8((long)psVar89,lVar87) !=
                SBORROW8(lVar86,(ulong)(psVar69 < (secp256k1_gej *)-uVar72))) !=
                (long)(lVar86 - (ulong)(psVar69 < (secp256k1_gej *)-uVar72)) < 0) break;
          } while( true );
        }
        psStack_3a0 = (secp256k1_modinv64_signed62 *)0x1429a4;
        secp256k1_modinv64_update_de_62_cold_7();
        goto LAB_001429a4;
      }
      lVar91 = (-0x8000000000000000 - (long)psVar90) - (ulong)(puVar73 != (uint64_t *)0x0);
      lVar87 = (long)psVar89 - lVar91;
      if ((SBORROW8((long)psVar89,lVar91) !=
          SBORROW8(lVar87,(ulong)(psVar99 < (secp256k1_gej *)-(long)puVar73))) !=
          (long)(lVar87 - (ulong)(psVar99 < (secp256k1_gej *)-(long)puVar73)) < 0)
      goto LAB_001422a7;
LAB_001420e6:
      psVar116 = (secp256k1_modinv64_signed62 *)((ulong)psVar116 & uStack_398);
      psVar79 = (secp256k1_gej *)
                ((long)psVar116 +
                (((ulong)psVar79 & (ulong)psStack_390) -
                ((long)psVar116->v + uVar72 * (long)psVar109 + ((ulong)psVar79 & (ulong)psStack_390)
                & 0x3fffffffffffffff)));
      bVar117 = CARRY8((ulong)puVar73,(ulong)psVar99);
      puVar73 = (uint64_t *)((long)(psVar99->x).n + (long)puVar73);
      psVar90 = (secp256k1_gej *)((long)(psVar89->x).n + (long)(psVar90->x).n + (ulong)bVar117);
      uVar72 = (long)psVar79 * lVar115;
      lVar115 = SUB168(SEXT816((long)psVar79) * SEXT816(lVar115),8);
      if (lVar115 < 0) goto LAB_001422ac;
      uVar68 = (ulong)((secp256k1_gej *)(-uVar72 - 1) < psVar109);
      lVar87 = (0x7fffffffffffffff - lVar115) - lVar86;
      if ((SBORROW8(0x7fffffffffffffff - lVar115,lVar86) != SBORROW8(lVar87,uVar68)) !=
          (long)(lVar87 - uVar68) < 0) goto LAB_001422ce;
LAB_00142136:
      bVar117 = CARRY8(uVar72,(ulong)psVar109);
      uVar72 = (long)(psVar109->x).n + uVar72;
      lVar115 = lVar115 + lVar86 + (ulong)bVar117;
      if (((ulong)puVar73 & 0x3fffffffffffffff) != 0) goto LAB_001429c2;
      psVar78 = psVar116;
      if ((uVar72 & 0x3fffffffffffffff) == 0) {
        uVar68 = (ulong)puVar73 >> 0x3e | (long)psVar90 << 2;
        psVar109 = (secp256k1_gej *)(uStack_388 * uStack_340 + uVar68);
        psVar99 = (secp256k1_gej *)
                  (SUB168(SEXT816((long)uStack_388) * SEXT816((long)uStack_340),8) +
                   ((long)psVar90 >> 0x3e) + (ulong)CARRY8(uStack_388 * uStack_340,uVar68));
        uVar68 = (long)psStack_380 * (long)psStack_328;
        lVar86 = SUB168(SEXT816((long)psStack_380) * SEXT816((long)psStack_328),8);
        psVar90 = psStack_328;
        if (lVar86 < 0) goto LAB_001422d3;
        psVar89 = (secp256k1_gej *)(-1 - uVar68);
        lVar87 = (0x7fffffffffffffff - lVar86) - (long)psVar99;
        psVar69 = (secp256k1_gej *)(lVar87 - (ulong)(psVar89 < psVar109));
        if ((SBORROW8(0x7fffffffffffffff - lVar86,(long)psVar99) !=
            SBORROW8(lVar87,(ulong)(psVar89 < psVar109))) != (long)psVar69 < 0) goto LAB_001422f8;
        goto LAB_001421b9;
      }
      goto LAB_001429c7;
    }
  }
  iVar63 = (int)uVar65;
  psStack_3a0 = (secp256k1_modinv64_signed62 *)secp256k1_modinv64_mul_cmp_62;
  secp256k1_modinv64_update_de_62_cold_27();
  psVar116 = &sStack_400;
  psStack_3b0 = psVar108;
  psStack_3a8 = a_02;
  psStack_3a0 = psVar78;
  secp256k1_modinv64_mul_62(&sStack_3d8,(secp256k1_modinv64_signed62 *)psVar89,iVar63,1);
  psVar78 = a_00;
  secp256k1_modinv64_mul_62(&sStack_400,a_00,5,(int64_t)psVar79);
  lVar115 = 0;
  while ((ulong)sStack_3d8.v[lVar115] < 0x4000000000000000) {
    if (0x3fffffffffffffff < (ulong)sStack_400.v[lVar115]) goto LAB_00142a8e;
    lVar115 = lVar115 + 1;
    if (lVar115 == 4) {
      uVar93 = 4;
      while( true ) {
        if (sStack_3d8.v[uVar93] < sStack_400.v[uVar93]) {
          return;
        }
        if (sStack_400.v[uVar93] < sStack_3d8.v[uVar93]) break;
        bVar117 = uVar93 == 0;
        uVar93 = uVar93 - 1;
        if (bVar117) {
          return;
        }
      }
      return;
    }
  }
  secp256k1_modinv64_mul_cmp_62_cold_2();
LAB_00142a8e:
  secp256k1_modinv64_mul_cmp_62_cold_1();
  iVar63 = (int)psVar116;
  if (iVar63 < 1) {
LAB_00142d3b:
    secp256k1_modinv64_update_fg_62_var_cold_9();
LAB_00142d40:
    secp256k1_modinv64_update_fg_62_var_cold_1();
LAB_00142d45:
    secp256k1_modinv64_update_fg_62_var_cold_2();
LAB_00142d4a:
    secp256k1_modinv64_update_fg_62_var_cold_6();
LAB_00142d4f:
    secp256k1_modinv64_update_fg_62_var_cold_5();
LAB_00142d54:
    secp256k1_modinv64_update_fg_62_var_cold_8();
  }
  else {
    uVar1 = (psVar79->x).n[0];
    uVar2 = (psVar79->x).n[1];
    lVar115 = psVar78->v[0];
    lVar86 = *extraout_RDX_09;
    uVar65 = lVar115 * uVar1;
    lVar91 = SUB168(SEXT816(lVar115) * SEXT816((long)uVar1),8);
    uVar72 = lVar86 * uVar2;
    lVar88 = SUB168(SEXT816(lVar86) * SEXT816((long)uVar2),8);
    lVar87 = (0x7fffffffffffffff - lVar88) - lVar91;
    if ((SBORROW8(0x7fffffffffffffff - lVar88,lVar91) != SBORROW8(lVar87,(ulong)(~uVar72 < uVar65)))
        != (long)(lVar87 - (ulong)(~uVar72 < uVar65)) < 0 && -1 < lVar88) goto LAB_00142d54;
    uVar3 = (psVar79->x).n[2];
    uVar4 = (psVar79->x).n[3];
    lVar91 = lVar88 + lVar91 + (ulong)CARRY8(uVar72,uVar65);
    uVar66 = lVar115 * uVar3;
    lVar87 = SUB168(SEXT816(lVar115) * SEXT816((long)uVar3),8);
    uVar67 = lVar86 * uVar4;
    lVar86 = SUB168(SEXT816(lVar86) * SEXT816((long)uVar4),8);
    uVar68 = (ulong)(-uVar67 - 1 < uVar66);
    lVar115 = (0x7fffffffffffffff - lVar86) - lVar87;
    if ((SBORROW8(0x7fffffffffffffff - lVar86,lVar87) != SBORROW8(lVar115,uVar68)) ==
        (long)(lVar115 - uVar68) < 0 || lVar86 < 0) {
      lVar115 = lVar86 + lVar87 + (ulong)CARRY8(uVar67,uVar66);
      if ((uVar72 + uVar65 & 0x3fffffffffffffff) != 0) goto LAB_00142d40;
      if ((uVar67 + uVar66 & 0x3fffffffffffffff) != 0) goto LAB_00142d45;
      uVar68 = uVar67 + uVar66 >> 0x3e | lVar115 * 4;
      uVar65 = uVar72 + uVar65 >> 0x3e | lVar91 * 4;
      lVar115 = lVar115 >> 0x3e;
      lVar91 = lVar91 >> 0x3e;
      if (iVar63 != 1) {
        psVar116 = (secp256k1_modinv64_signed62 *)((ulong)psVar116 & 0xffffffff);
        psVar80 = (secp256k1_modinv64_signed62 *)0x1;
        do {
          lVar86 = psVar78->v[(long)psVar80];
          uVar66 = lVar86 * uVar1 + uVar65;
          lVar88 = SUB168(SEXT816(lVar86) * SEXT816((long)uVar1),8) + lVar91 +
                   (ulong)CARRY8(lVar86 * uVar1,uVar65);
          lVar87 = extraout_RDX_09[(long)psVar80];
          uVar72 = lVar87 * uVar2;
          lVar91 = SUB168(SEXT816(lVar87) * SEXT816((long)uVar2),8);
          if (lVar91 < 0) {
            lVar114 = (-0x8000000000000000 - lVar91) - (ulong)(uVar72 != 0);
            lVar75 = lVar88 - lVar114;
            if ((SBORROW8(lVar88,lVar114) != SBORROW8(lVar75,(ulong)(uVar66 < -uVar72))) ==
                (long)(lVar75 - (ulong)(uVar66 < -uVar72)) < 0) goto LAB_00142c2a;
LAB_00142d31:
            secp256k1_modinv64_update_fg_62_var_cold_4();
LAB_00142d36:
            secp256k1_modinv64_update_fg_62_var_cold_3();
            goto LAB_00142d3b;
          }
          uVar65 = (ulong)(-uVar72 - 1 < uVar66);
          lVar75 = (0x7fffffffffffffff - lVar91) - lVar88;
          if ((SBORROW8(0x7fffffffffffffff - lVar91,lVar88) != SBORROW8(lVar75,uVar65)) !=
              (long)(lVar75 - uVar65) < 0) goto LAB_00142d31;
LAB_00142c2a:
          lVar91 = lVar88 + lVar91 + (ulong)CARRY8(uVar66,uVar72);
          uVar107 = lVar86 * uVar3 + uVar68;
          lVar86 = SUB168(SEXT816(lVar86) * SEXT816((long)uVar3),8) + lVar115 +
                   (ulong)CARRY8(lVar86 * uVar3,uVar68);
          uVar67 = lVar87 * uVar4;
          lVar115 = SUB168(SEXT816(lVar87) * SEXT816((long)uVar4),8);
          if (lVar115 < 0) {
            lVar88 = (-0x8000000000000000 - lVar115) - (ulong)(uVar67 != 0);
            lVar87 = lVar86 - lVar88;
            if ((SBORROW8(lVar86,lVar88) != SBORROW8(lVar87,(ulong)(uVar107 < -uVar67))) !=
                (long)(lVar87 - (ulong)(uVar107 < -uVar67)) < 0) goto LAB_00142d36;
          }
          else {
            uVar65 = (ulong)(-uVar67 - 1 < uVar107);
            lVar87 = (0x7fffffffffffffff - lVar115) - lVar86;
            if ((SBORROW8(0x7fffffffffffffff - lVar115,lVar86) != SBORROW8(lVar87,uVar65)) !=
                (long)(lVar87 - uVar65) < 0) goto LAB_00142d36;
          }
          lVar115 = lVar86 + lVar115 + (ulong)CARRY8(uVar107,uVar67);
          uVar65 = lVar91 * 4 | uVar66 + uVar72 >> 0x3e;
          psVar78->v[(long)((long)psVar80[-1].v + 0x27)] = uVar66 + uVar72 & 0x3fffffffffffffff;
          uVar68 = lVar115 * 4 | uVar107 + uVar67 >> 0x3e;
          extraout_RDX_09[(long)((long)psVar80[-1].v + 0x27)] =
               uVar107 + uVar67 & 0x3fffffffffffffff;
          psVar80 = (secp256k1_modinv64_signed62 *)((long)psVar80->v + 1);
          lVar115 = lVar115 >> 0x3e;
          lVar91 = lVar91 >> 0x3e;
        } while (psVar116 != psVar80);
      }
      if (lVar91 + -1 + (ulong)(0x7fffffffffffffff < uVar65) != -1) goto LAB_00142d4a;
      psVar78->v[(long)iVar63 + -1] = uVar65;
      if (lVar115 + -1 + (ulong)(0x7fffffffffffffff < uVar68) == -1) {
        extraout_RDX_09[(long)iVar63 + -1] = uVar68;
        return;
      }
      goto LAB_00142d4f;
    }
  }
  secp256k1_modinv64_update_fg_62_var_cold_7();
  lVar115 = psVar116->v[0];
  lVar86 = psVar116->v[1];
  lVar87 = psVar116->v[2];
  lVar91 = psVar116->v[3];
  lVar88 = psVar116->v[4];
  lVar75 = 0;
  do {
    if (psVar116->v[lVar75] < -0x3fffffffffffffff) {
      secp256k1_modinv64_normalize_62_cold_7();
LAB_00142f8a:
      secp256k1_modinv64_normalize_62_cold_6();
      goto LAB_00142f8f;
    }
    if (0x3fffffffffffffff < psVar116->v[lVar75]) goto LAB_00142f8a;
    lVar75 = lVar75 + 1;
  } while (lVar75 != 5);
  iVar63 = secp256k1_modinv64_mul_cmp_62(psVar116,5,b_00,-2);
  if (iVar63 < 1) {
LAB_00142f8f:
    secp256k1_modinv64_normalize_62_cold_5();
LAB_00142f94:
    secp256k1_modinv64_normalize_62_cold_4();
LAB_00142f99:
    secp256k1_modinv64_normalize_62_cold_3();
  }
  else {
    iVar63 = secp256k1_modinv64_mul_cmp_62(psVar116,5,b_00,1);
    if (-1 < iVar63) goto LAB_00142f94;
    uVar65 = lVar88 >> 0x3f;
    uVar66 = (long)psVar78 >> 0x3f;
    uVar72 = ((uVar65 & b_00->v[0]) + lVar115 ^ uVar66) - uVar66;
    uVar67 = ((long)uVar72 >> 0x3e) + (((uVar65 & b_00->v[1]) + lVar86 ^ uVar66) - uVar66);
    uVar107 = ((long)uVar67 >> 0x3e) + ((lVar87 + (uVar65 & b_00->v[2]) ^ uVar66) - uVar66);
    uVar68 = ((long)uVar107 >> 0x3e) + (((uVar65 & b_00->v[3]) + lVar91 ^ uVar66) - uVar66);
    lVar115 = ((long)uVar68 >> 0x3e) + (((uVar65 & b_00->v[4]) + lVar88 ^ uVar66) - uVar66);
    uVar66 = lVar115 >> 0x3f;
    uVar65 = (b_00->v[0] & uVar66) + (uVar72 & 0x3fffffffffffffff);
    uVar67 = ((long)uVar65 >> 0x3e) + (b_00->v[1] & uVar66) + (uVar67 & 0x3fffffffffffffff);
    uVar72 = ((long)uVar67 >> 0x3e) + (b_00->v[2] & uVar66) + (uVar107 & 0x3fffffffffffffff);
    uVar68 = ((long)uVar72 >> 0x3e) + (b_00->v[3] & uVar66) + (uVar68 & 0x3fffffffffffffff);
    uVar66 = (b_00->v[4] & uVar66) + lVar115 + ((long)uVar68 >> 0x3e);
    psVar116->v[0] = uVar65 & 0x3fffffffffffffff;
    psVar116->v[1] = uVar67 & 0x3fffffffffffffff;
    psVar116->v[2] = uVar72 & 0x3fffffffffffffff;
    psVar116->v[3] = uVar68 & 0x3fffffffffffffff;
    psVar116->v[4] = uVar66;
    if (0x3fffffffffffffff < uVar66) goto LAB_00142f99;
    iVar63 = secp256k1_modinv64_mul_cmp_62(psVar116,5,b_00,0);
    if (-1 < iVar63) {
      iVar63 = secp256k1_modinv64_mul_cmp_62(psVar116,5,b_00,1);
      if (iVar63 < 0) {
        return;
      }
      goto LAB_00142fa3;
    }
  }
  secp256k1_modinv64_normalize_62_cold_2();
LAB_00142fa3:
  secp256k1_modinv64_normalize_62_cold_1();
  return;
}

Assistant:

static void secp256k1_scalar_mul(secp256k1_scalar *r, const secp256k1_scalar *a, const secp256k1_scalar *b) {
    uint64_t l[8];
    SECP256K1_SCALAR_VERIFY(a);
    SECP256K1_SCALAR_VERIFY(b);

    secp256k1_scalar_mul_512(l, a, b);
    secp256k1_scalar_reduce_512(r, l);

    SECP256K1_SCALAR_VERIFY(r);
}